

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx2::CurveNiMBIntersectorK<8,4>::
     intersect_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Primitive PVar11;
  uint uVar12;
  undefined4 uVar13;
  Geometry *pGVar14;
  __int_type_conflict _Var15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  undefined1 auVar18 [32];
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [28];
  uint uVar98;
  uint uVar99;
  ulong uVar100;
  ulong uVar101;
  uint uVar102;
  long lVar103;
  long lVar104;
  int iVar105;
  long lVar106;
  undefined4 uVar107;
  undefined8 unaff_R13;
  long lVar108;
  undefined1 auVar110 [16];
  undefined8 uVar109;
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar112 [32];
  undefined1 auVar111 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar129;
  float fVar131;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  float fVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar155;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar156;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar157;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar206;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_860 [32];
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined1 local_800 [16];
  ulong local_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  RTCFilterFunctionNArguments local_7b0;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 (*local_718) [16];
  Precalculations *local_710;
  ulong local_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined4 uStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_690 [16];
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  LinearSpace3fa *local_590;
  Primitive *local_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined4 local_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined1 local_410 [16];
  uint local_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  int local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar11 = prim[1];
  uVar100 = (ulong)(byte)PVar11;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = *(ulong *)(prim + uVar100 * 4 + 6);
  auVar209 = vpmovsxbd_avx2(auVar180);
  lVar106 = uVar100 * 0x25;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = *(ulong *)(prim + uVar100 * 5 + 6);
  auVar115 = vpmovsxbd_avx2(auVar178);
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + uVar100 * 6 + 6);
  auVar126 = vpmovsxbd_avx2(auVar179);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar100 * 0xf + 6);
  auVar112 = vpmovsxbd_avx2(auVar5);
  auVar140._1_3_ = 0;
  auVar140[0] = PVar11;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + 6);
  auVar120 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar100 * 0x11 + 6);
  auVar145 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar100 * 0x1a + 6);
  auVar139 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar100 * 0x1b + 6);
  auVar124 = vpmovsxbd_avx2(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar100 * 0x1c + 6);
  auVar123 = vpmovsxbd_avx2(auVar10);
  auVar180 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar180 = vinsertps_avx(auVar180,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar178 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  fVar157 = *(float *)(prim + lVar106 + 0x12);
  auVar179 = vsubps_avx(auVar180,*(undefined1 (*) [16])(prim + lVar106 + 6));
  fVar21 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar106 + 0x16)) *
           *(float *)(prim + lVar106 + 0x1a);
  auVar180 = vinsertps_avx(auVar178,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar197._0_4_ = fVar157 * auVar179._0_4_;
  auVar197._4_4_ = fVar157 * auVar179._4_4_;
  auVar197._8_4_ = fVar157 * auVar179._8_4_;
  auVar197._12_4_ = fVar157 * auVar179._12_4_;
  auVar231._0_4_ = fVar157 * auVar180._0_4_;
  auVar231._4_4_ = fVar157 * auVar180._4_4_;
  auVar231._8_4_ = fVar157 * auVar180._8_4_;
  auVar231._12_4_ = fVar157 * auVar180._12_4_;
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar18 = vcvtdq2ps_avx(auVar123);
  auVar180 = vmovshdup_avx(auVar231);
  auVar186._0_8_ = auVar180._0_8_;
  auVar186._8_8_ = auVar186._0_8_;
  auVar186._16_8_ = auVar186._0_8_;
  auVar186._24_8_ = auVar186._0_8_;
  auVar180 = vshufps_avx(auVar231,auVar231,0xaa);
  fVar157 = auVar180._0_4_;
  auVar212._0_4_ = fVar157 * auVar126._0_4_;
  fVar206 = auVar180._4_4_;
  auVar212._4_4_ = fVar206 * auVar126._4_4_;
  auVar212._8_4_ = fVar157 * auVar126._8_4_;
  auVar212._12_4_ = fVar206 * auVar126._12_4_;
  auVar212._16_4_ = fVar157 * auVar126._16_4_;
  auVar212._20_4_ = fVar206 * auVar126._20_4_;
  auVar212._24_4_ = fVar157 * auVar126._24_4_;
  auVar212._28_4_ = 0;
  auVar113._4_4_ = fVar206 * auVar145._4_4_;
  auVar113._0_4_ = fVar157 * auVar145._0_4_;
  auVar113._8_4_ = fVar157 * auVar145._8_4_;
  auVar113._12_4_ = fVar206 * auVar145._12_4_;
  auVar113._16_4_ = fVar157 * auVar145._16_4_;
  auVar113._20_4_ = fVar206 * auVar145._20_4_;
  auVar113._24_4_ = fVar157 * auVar145._24_4_;
  auVar113._28_4_ = auVar123._28_4_;
  auVar123._4_4_ = auVar18._4_4_ * fVar206;
  auVar123._0_4_ = auVar18._0_4_ * fVar157;
  auVar123._8_4_ = auVar18._8_4_ * fVar157;
  auVar123._12_4_ = auVar18._12_4_ * fVar206;
  auVar123._16_4_ = auVar18._16_4_ * fVar157;
  auVar123._20_4_ = auVar18._20_4_ * fVar206;
  auVar123._24_4_ = auVar18._24_4_ * fVar157;
  auVar123._28_4_ = fVar206;
  auVar178 = vfmadd231ps_fma(auVar212,auVar186,auVar115);
  auVar179 = vfmadd231ps_fma(auVar113,auVar186,auVar120);
  auVar5 = vfmadd231ps_fma(auVar123,auVar124,auVar186);
  auVar180 = vshufps_avx(auVar197,auVar197,0xaa);
  fVar157 = auVar180._0_4_;
  auVar187._0_4_ = fVar157 * auVar126._0_4_;
  fVar206 = auVar180._4_4_;
  auVar187._4_4_ = fVar206 * auVar126._4_4_;
  auVar187._8_4_ = fVar157 * auVar126._8_4_;
  auVar187._12_4_ = fVar206 * auVar126._12_4_;
  auVar187._16_4_ = fVar157 * auVar126._16_4_;
  auVar187._20_4_ = fVar206 * auVar126._20_4_;
  auVar187._24_4_ = fVar157 * auVar126._24_4_;
  auVar187._28_4_ = 0;
  auVar234._4_4_ = fVar206 * auVar145._4_4_;
  auVar234._0_4_ = fVar157 * auVar145._0_4_;
  auVar234._8_4_ = fVar157 * auVar145._8_4_;
  auVar234._12_4_ = fVar206 * auVar145._12_4_;
  auVar234._16_4_ = fVar157 * auVar145._16_4_;
  auVar234._20_4_ = fVar206 * auVar145._20_4_;
  auVar234._24_4_ = fVar157 * auVar145._24_4_;
  auVar234._28_4_ = auVar145._28_4_;
  auVar22._4_4_ = fVar206 * auVar18._4_4_;
  auVar22._0_4_ = fVar157 * auVar18._0_4_;
  auVar22._8_4_ = fVar157 * auVar18._8_4_;
  auVar22._12_4_ = fVar206 * auVar18._12_4_;
  auVar22._16_4_ = fVar157 * auVar18._16_4_;
  auVar22._20_4_ = fVar206 * auVar18._20_4_;
  auVar22._24_4_ = fVar157 * auVar18._24_4_;
  auVar22._28_4_ = auVar126._28_4_;
  auVar180 = vmovshdup_avx(auVar197);
  auVar227._0_8_ = auVar180._0_8_;
  auVar227._8_8_ = auVar227._0_8_;
  auVar227._16_8_ = auVar227._0_8_;
  auVar227._24_8_ = auVar227._0_8_;
  auVar180 = vfmadd231ps_fma(auVar187,auVar227,auVar115);
  auVar145 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 7 + 6));
  auVar6 = vfmadd231ps_fma(auVar234,auVar227,auVar120);
  auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0xb + 6));
  auVar7 = vfmadd231ps_fma(auVar22,auVar227,auVar124);
  auVar123 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 9 + 6));
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0xd + 6));
  auVar115 = vcvtdq2ps_avx(auVar209);
  auVar126 = vcvtdq2ps_avx(auVar112);
  auVar120 = vcvtdq2ps_avx(auVar139);
  auVar217._4_4_ = auVar231._0_4_;
  auVar217._0_4_ = auVar231._0_4_;
  auVar217._8_4_ = auVar231._0_4_;
  auVar217._12_4_ = auVar231._0_4_;
  auVar217._16_4_ = auVar231._0_4_;
  auVar217._20_4_ = auVar231._0_4_;
  auVar217._24_4_ = auVar231._0_4_;
  auVar217._28_4_ = auVar231._0_4_;
  auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),auVar217,auVar115);
  auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar217,auVar126);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar120,auVar217);
  auVar200._4_4_ = auVar197._0_4_;
  auVar200._0_4_ = auVar197._0_4_;
  auVar200._8_4_ = auVar197._0_4_;
  auVar200._12_4_ = auVar197._0_4_;
  auVar200._16_4_ = auVar197._0_4_;
  auVar200._20_4_ = auVar197._0_4_;
  auVar200._24_4_ = auVar197._0_4_;
  auVar200._28_4_ = auVar197._0_4_;
  auVar197 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar200,auVar115);
  auVar231 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar200,auVar126);
  auVar110 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar200,auVar120);
  local_180._8_4_ = 0x7fffffff;
  local_180._0_8_ = 0x7fffffff7fffffff;
  local_180._12_4_ = 0x7fffffff;
  local_180._16_4_ = 0x7fffffff;
  local_180._20_4_ = 0x7fffffff;
  local_180._24_4_ = 0x7fffffff;
  local_180._28_4_ = 0x7fffffff;
  auVar112._8_4_ = 0x219392ef;
  auVar112._0_8_ = 0x219392ef219392ef;
  auVar112._12_4_ = 0x219392ef;
  auVar112._16_4_ = 0x219392ef;
  auVar112._20_4_ = 0x219392ef;
  auVar112._24_4_ = 0x219392ef;
  auVar112._28_4_ = 0x219392ef;
  auVar115 = vandps_avx(ZEXT1632(auVar178),local_180);
  auVar115 = vcmpps_avx(auVar115,auVar112,1);
  auVar126 = vblendvps_avx(ZEXT1632(auVar178),auVar112,auVar115);
  auVar115 = vandps_avx(ZEXT1632(auVar179),local_180);
  auVar115 = vcmpps_avx(auVar115,auVar112,1);
  auVar120 = vblendvps_avx(ZEXT1632(auVar179),auVar112,auVar115);
  auVar115 = vandps_avx(ZEXT1632(auVar5),local_180);
  auVar115 = vcmpps_avx(auVar115,auVar112,1);
  auVar115 = vblendvps_avx(ZEXT1632(auVar5),auVar112,auVar115);
  auVar207._4_4_ = fVar21;
  auVar207._0_4_ = fVar21;
  auVar207._8_4_ = fVar21;
  auVar207._12_4_ = fVar21;
  auVar207._16_4_ = fVar21;
  auVar207._20_4_ = fVar21;
  auVar207._24_4_ = fVar21;
  auVar207._28_4_ = fVar21;
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar124 = vcvtdq2ps_avx(auVar18);
  auVar124 = vsubps_avx(auVar124,auVar145);
  auVar5 = vfmadd213ps_fma(auVar124,auVar207,auVar145);
  auVar145 = vcvtdq2ps_avx(auVar123);
  auVar124 = vcvtdq2ps_avx(auVar113);
  auVar124 = vsubps_avx(auVar124,auVar145);
  auVar6 = vfmadd213ps_fma(auVar124,auVar207,auVar145);
  auVar145 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0x12 + 6));
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0x16 + 6));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,auVar145);
  auVar7 = vfmadd213ps_fma(auVar124,auVar207,auVar145);
  auVar145 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0x14 + 6));
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0x18 + 6));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,auVar145);
  auVar8 = vfmadd213ps_fma(auVar124,auVar207,auVar145);
  auVar145 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0x1d + 6));
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0x21 + 6));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,auVar145);
  auVar9 = vfmadd213ps_fma(auVar124,auVar207,auVar145);
  auVar145 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0x1f + 6));
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0x23 + 6));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,auVar145);
  auVar10 = vfmadd213ps_fma(auVar124,auVar207,auVar145);
  auVar145 = vrcpps_avx(auVar126);
  auVar219._8_4_ = 0x3f800000;
  auVar219._0_8_ = 0x3f8000003f800000;
  auVar219._12_4_ = 0x3f800000;
  auVar219._16_4_ = 0x3f800000;
  auVar219._20_4_ = 0x3f800000;
  auVar219._24_4_ = 0x3f800000;
  auVar219._28_4_ = 0x3f800000;
  auVar180 = vfnmadd213ps_fma(auVar126,auVar145,auVar219);
  auVar180 = vfmadd132ps_fma(ZEXT1632(auVar180),auVar145,auVar145);
  auVar126 = vrcpps_avx(auVar120);
  auVar178 = vfnmadd213ps_fma(auVar120,auVar126,auVar219);
  auVar178 = vfmadd132ps_fma(ZEXT1632(auVar178),auVar126,auVar126);
  auVar126 = vrcpps_avx(auVar115);
  auVar179 = vfnmadd213ps_fma(auVar115,auVar126,auVar219);
  auVar179 = vfmadd132ps_fma(ZEXT1632(auVar179),auVar126,auVar126);
  auVar115 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar197));
  auVar120._4_4_ = auVar180._4_4_ * auVar115._4_4_;
  auVar120._0_4_ = auVar180._0_4_ * auVar115._0_4_;
  auVar120._8_4_ = auVar180._8_4_ * auVar115._8_4_;
  auVar120._12_4_ = auVar180._12_4_ * auVar115._12_4_;
  auVar120._16_4_ = auVar115._16_4_ * 0.0;
  auVar120._20_4_ = auVar115._20_4_ * 0.0;
  auVar120._24_4_ = auVar115._24_4_ * 0.0;
  auVar120._28_4_ = auVar115._28_4_;
  auVar115 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar197));
  auVar145._4_4_ = auVar180._4_4_ * auVar115._4_4_;
  auVar145._0_4_ = auVar180._0_4_ * auVar115._0_4_;
  auVar145._8_4_ = auVar180._8_4_ * auVar115._8_4_;
  auVar145._12_4_ = auVar180._12_4_ * auVar115._12_4_;
  auVar145._16_4_ = auVar115._16_4_ * 0.0;
  auVar145._20_4_ = auVar115._20_4_ * 0.0;
  auVar145._24_4_ = auVar115._24_4_ * 0.0;
  auVar145._28_4_ = auVar115._28_4_;
  auVar115 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar231));
  auVar124._4_4_ = auVar178._4_4_ * auVar115._4_4_;
  auVar124._0_4_ = auVar178._0_4_ * auVar115._0_4_;
  auVar124._8_4_ = auVar178._8_4_ * auVar115._8_4_;
  auVar124._12_4_ = auVar178._12_4_ * auVar115._12_4_;
  auVar124._16_4_ = auVar115._16_4_ * 0.0;
  auVar124._20_4_ = auVar115._20_4_ * 0.0;
  auVar124._24_4_ = auVar115._24_4_ * 0.0;
  auVar124._28_4_ = auVar115._28_4_;
  auVar115 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar231));
  auVar18._4_4_ = auVar178._4_4_ * auVar115._4_4_;
  auVar18._0_4_ = auVar178._0_4_ * auVar115._0_4_;
  auVar18._8_4_ = auVar178._8_4_ * auVar115._8_4_;
  auVar18._12_4_ = auVar178._12_4_ * auVar115._12_4_;
  auVar18._16_4_ = auVar115._16_4_ * 0.0;
  auVar18._20_4_ = auVar115._20_4_ * 0.0;
  auVar18._24_4_ = auVar115._24_4_ * 0.0;
  auVar18._28_4_ = auVar115._28_4_;
  auVar115 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar110));
  auVar209._4_4_ = auVar179._4_4_ * auVar115._4_4_;
  auVar209._0_4_ = auVar179._0_4_ * auVar115._0_4_;
  auVar209._8_4_ = auVar179._8_4_ * auVar115._8_4_;
  auVar209._12_4_ = auVar179._12_4_ * auVar115._12_4_;
  auVar209._16_4_ = auVar115._16_4_ * 0.0;
  auVar209._20_4_ = auVar115._20_4_ * 0.0;
  auVar209._24_4_ = auVar115._24_4_ * 0.0;
  auVar209._28_4_ = auVar115._28_4_;
  auVar115 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar110));
  auVar139._0_4_ = auVar179._0_4_ * auVar115._0_4_;
  auVar139._4_4_ = auVar179._4_4_ * auVar115._4_4_;
  auVar139._8_4_ = auVar179._8_4_ * auVar115._8_4_;
  auVar139._12_4_ = auVar179._12_4_ * auVar115._12_4_;
  auVar139._16_4_ = auVar115._16_4_ * 0.0;
  auVar139._20_4_ = auVar115._20_4_ * 0.0;
  auVar139._24_4_ = auVar115._24_4_ * 0.0;
  auVar139._28_4_ = 0;
  auVar115 = vpminsd_avx2(auVar120,auVar145);
  auVar126 = vpminsd_avx2(auVar124,auVar18);
  auVar115 = vmaxps_avx(auVar115,auVar126);
  auVar126 = vpminsd_avx2(auVar209,auVar139);
  uVar107 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar208._4_4_ = uVar107;
  auVar208._0_4_ = uVar107;
  auVar208._8_4_ = uVar107;
  auVar208._12_4_ = uVar107;
  auVar208._16_4_ = uVar107;
  auVar208._20_4_ = uVar107;
  auVar208._24_4_ = uVar107;
  auVar208._28_4_ = uVar107;
  auVar126 = vmaxps_avx(auVar126,auVar208);
  auVar115 = vmaxps_avx(auVar115,auVar126);
  local_80._4_4_ = auVar115._4_4_ * 0.99999964;
  local_80._0_4_ = auVar115._0_4_ * 0.99999964;
  local_80._8_4_ = auVar115._8_4_ * 0.99999964;
  local_80._12_4_ = auVar115._12_4_ * 0.99999964;
  local_80._16_4_ = auVar115._16_4_ * 0.99999964;
  local_80._20_4_ = auVar115._20_4_ * 0.99999964;
  local_80._24_4_ = auVar115._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar115 = vpmaxsd_avx2(auVar120,auVar145);
  auVar126 = vpmaxsd_avx2(auVar124,auVar18);
  auVar115 = vminps_avx(auVar115,auVar126);
  auVar126 = vpmaxsd_avx2(auVar209,auVar139);
  uVar107 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar168._4_4_ = uVar107;
  auVar168._0_4_ = uVar107;
  auVar168._8_4_ = uVar107;
  auVar168._12_4_ = uVar107;
  auVar168._16_4_ = uVar107;
  auVar168._20_4_ = uVar107;
  auVar168._24_4_ = uVar107;
  auVar168._28_4_ = uVar107;
  auVar126 = vminps_avx(auVar126,auVar168);
  auVar115 = vminps_avx(auVar115,auVar126);
  auVar126._4_4_ = auVar115._4_4_ * 1.0000004;
  auVar126._0_4_ = auVar115._0_4_ * 1.0000004;
  auVar126._8_4_ = auVar115._8_4_ * 1.0000004;
  auVar126._12_4_ = auVar115._12_4_ * 1.0000004;
  auVar126._16_4_ = auVar115._16_4_ * 1.0000004;
  auVar126._20_4_ = auVar115._20_4_ * 1.0000004;
  auVar126._24_4_ = auVar115._24_4_ * 1.0000004;
  auVar126._28_4_ = auVar115._28_4_;
  auVar140[4] = PVar11;
  auVar140._5_3_ = 0;
  auVar140[8] = PVar11;
  auVar140._9_3_ = 0;
  auVar140[0xc] = PVar11;
  auVar140._13_3_ = 0;
  auVar140[0x10] = PVar11;
  auVar140._17_3_ = 0;
  auVar140[0x14] = PVar11;
  auVar140._21_3_ = 0;
  auVar140[0x18] = PVar11;
  auVar140._25_3_ = 0;
  auVar140[0x1c] = PVar11;
  auVar140._29_3_ = 0;
  auVar115 = vcmpps_avx(local_80,auVar126,2);
  auVar126 = vpcmpgtd_avx2(auVar140,_DAT_01fb4ba0);
  auVar115 = vandps_avx(auVar115,auVar126);
  uVar107 = vmovmskps_avx(auVar115);
  uVar100 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar107);
  local_590 = pre->ray_space + k;
  local_580 = mm_lookupmask_ps._16_8_;
  uStack_578 = mm_lookupmask_ps._24_8_;
  uStack_570 = mm_lookupmask_ps._16_8_;
  uStack_568 = mm_lookupmask_ps._24_8_;
  local_718 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_710 = pre;
  local_588 = prim;
  do {
    auVar115 = local_4c0;
    if (uVar100 == 0) {
      return;
    }
    lVar106 = 0;
    for (uVar101 = uVar100; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x8000000000000000) {
      lVar106 = lVar106 + 1;
    }
    uVar99 = *(uint *)(local_588 + 2);
    local_7e8 = (ulong)uVar99;
    uVar12 = *(uint *)(local_588 + lVar106 * 4 + 6);
    local_708 = (ulong)uVar12;
    pGVar14 = (context->scene->geometries).items[local_7e8].ptr;
    uVar101 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                              local_708 *
                              pGVar14[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar157 = (pGVar14->time_range).lower;
    fVar157 = pGVar14->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar157) / ((pGVar14->time_range).upper - fVar157))
    ;
    auVar180 = vroundss_avx(ZEXT416((uint)fVar157),ZEXT416((uint)fVar157),9);
    auVar180 = vminss_avx(auVar180,ZEXT416((uint)(pGVar14->fnumTimeSegments + -1.0)));
    auVar180 = vmaxss_avx(ZEXT816(0) << 0x20,auVar180);
    fVar157 = fVar157 - auVar180._0_4_;
    fVar21 = 1.0 - fVar157;
    _Var15 = pGVar14[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar103 = (long)(int)auVar180._0_4_ * 0x38;
    lVar108 = *(long *)(_Var15 + 0x10 + lVar103);
    lVar104 = *(long *)(_Var15 + 0x38 + lVar103);
    lVar16 = *(long *)(_Var15 + 0x48 + lVar103);
    pfVar1 = (float *)(lVar104 + lVar16 * uVar101);
    auVar158._0_4_ = fVar157 * *pfVar1;
    auVar158._4_4_ = fVar157 * pfVar1[1];
    auVar158._8_4_ = fVar157 * pfVar1[2];
    auVar158._12_4_ = fVar157 * pfVar1[3];
    lVar106 = uVar101 + 1;
    pfVar1 = (float *)(lVar104 + lVar16 * lVar106);
    auVar174._0_4_ = fVar157 * *pfVar1;
    auVar174._4_4_ = fVar157 * pfVar1[1];
    auVar174._8_4_ = fVar157 * pfVar1[2];
    auVar174._12_4_ = fVar157 * pfVar1[3];
    p_Var17 = pGVar14[4].occlusionFilterN;
    auVar110._4_4_ = fVar21;
    auVar110._0_4_ = fVar21;
    auVar110._8_4_ = fVar21;
    auVar110._12_4_ = fVar21;
    auVar7 = vfmadd231ps_fma(auVar158,auVar110,
                             *(undefined1 (*) [16])(*(long *)(_Var15 + lVar103) + lVar108 * uVar101)
                            );
    auVar8 = vfmadd231ps_fma(auVar174,auVar110,
                             *(undefined1 (*) [16])(*(long *)(_Var15 + lVar103) + lVar108 * lVar106)
                            );
    pfVar1 = (float *)(*(long *)(p_Var17 + lVar103 + 0x38) +
                      uVar101 * *(long *)(p_Var17 + lVar103 + 0x48));
    auVar159._0_4_ = fVar157 * *pfVar1;
    auVar159._4_4_ = fVar157 * pfVar1[1];
    auVar159._8_4_ = fVar157 * pfVar1[2];
    auVar159._12_4_ = fVar157 * pfVar1[3];
    pfVar1 = (float *)(*(long *)(p_Var17 + lVar103 + 0x38) +
                      *(long *)(p_Var17 + lVar103 + 0x48) * lVar106);
    auVar232._0_4_ = fVar157 * *pfVar1;
    auVar232._4_4_ = fVar157 * pfVar1[1];
    auVar232._8_4_ = fVar157 * pfVar1[2];
    auVar232._12_4_ = fVar157 * pfVar1[3];
    auVar178 = vfmadd231ps_fma(auVar159,auVar110,
                               *(undefined1 (*) [16])
                                (*(long *)(p_Var17 + lVar103) +
                                *(long *)(p_Var17 + lVar103 + 0x10) * uVar101));
    auVar179 = vfmadd231ps_fma(auVar232,auVar110,
                               *(undefined1 (*) [16])
                                (*(long *)(p_Var17 + lVar103) +
                                *(long *)(p_Var17 + lVar103 + 0x10) * lVar106));
    iVar105 = (int)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar180 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    auVar5 = vinsertps_avx(auVar180,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar136._8_4_ = 0xbeaaaaab;
    auVar136._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar136._12_4_ = 0xbeaaaaab;
    auVar158 = vfnmadd213ps_fma(auVar178,auVar136,auVar7);
    local_7c0 = vfmadd213ps_fma(auVar179,auVar136,auVar8);
    auVar178 = vsubps_avx(auVar7,auVar5);
    uVar107 = auVar178._0_4_;
    auVar175._4_4_ = uVar107;
    auVar175._0_4_ = uVar107;
    auVar175._8_4_ = uVar107;
    auVar175._12_4_ = uVar107;
    auVar180 = vshufps_avx(auVar178,auVar178,0x55);
    auVar178 = vshufps_avx(auVar178,auVar178,0xaa);
    aVar3 = (local_590->vx).field_0;
    aVar4 = (local_590->vy).field_0;
    fVar157 = (local_590->vz).field_0.m128[0];
    fVar21 = *(float *)((long)&(local_590->vz).field_0 + 4);
    fVar206 = *(float *)((long)&(local_590->vz).field_0 + 8);
    fVar19 = *(float *)((long)&(local_590->vz).field_0 + 0xc);
    auVar198._0_4_ = fVar157 * auVar178._0_4_;
    auVar198._4_4_ = fVar21 * auVar178._4_4_;
    auVar198._8_4_ = fVar206 * auVar178._8_4_;
    auVar198._12_4_ = fVar19 * auVar178._12_4_;
    auVar180 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar4,auVar180);
    auVar9 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar3,auVar175);
    auVar180 = vblendps_avx(auVar9,auVar7,8);
    auVar179 = vsubps_avx(auVar158,auVar5);
    uVar107 = auVar179._0_4_;
    auVar199._4_4_ = uVar107;
    auVar199._0_4_ = uVar107;
    auVar199._8_4_ = uVar107;
    auVar199._12_4_ = uVar107;
    auVar178 = vshufps_avx(auVar179,auVar179,0x55);
    auVar179 = vshufps_avx(auVar179,auVar179,0xaa);
    auVar211._0_4_ = fVar157 * auVar179._0_4_;
    auVar211._4_4_ = fVar21 * auVar179._4_4_;
    auVar211._8_4_ = fVar206 * auVar179._8_4_;
    auVar211._12_4_ = fVar19 * auVar179._12_4_;
    auVar178 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar4,auVar178);
    auVar10 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar3,auVar199);
    auVar178 = vblendps_avx(auVar10,auVar158,8);
    auVar6 = vsubps_avx(local_7c0,auVar5);
    uVar107 = auVar6._0_4_;
    auVar204._4_4_ = uVar107;
    auVar204._0_4_ = uVar107;
    auVar204._8_4_ = uVar107;
    auVar204._12_4_ = uVar107;
    auVar179 = vshufps_avx(auVar6,auVar6,0x55);
    auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
    auVar216._0_4_ = fVar157 * auVar6._0_4_;
    auVar216._4_4_ = fVar21 * auVar6._4_4_;
    auVar216._8_4_ = fVar206 * auVar6._8_4_;
    auVar216._12_4_ = fVar19 * auVar6._12_4_;
    auVar179 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar4,auVar179);
    auVar197 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar3,auVar204);
    auVar179 = vblendps_avx(auVar197,local_7c0,8);
    auVar6 = vsubps_avx(auVar8,auVar5);
    uVar107 = auVar6._0_4_;
    auVar205._4_4_ = uVar107;
    auVar205._0_4_ = uVar107;
    auVar205._8_4_ = uVar107;
    auVar205._12_4_ = uVar107;
    auVar5 = vshufps_avx(auVar6,auVar6,0x55);
    auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
    auVar221._0_4_ = fVar157 * auVar6._0_4_;
    auVar221._4_4_ = fVar21 * auVar6._4_4_;
    auVar221._8_4_ = fVar206 * auVar6._8_4_;
    auVar221._12_4_ = fVar19 * auVar6._12_4_;
    auVar5 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar4,auVar5);
    auVar231 = vfmadd231ps_fma(auVar5,(undefined1  [16])aVar3,auVar205);
    auVar111._8_4_ = 0x7fffffff;
    auVar111._0_8_ = 0x7fffffff7fffffff;
    auVar111._12_4_ = 0x7fffffff;
    auVar5 = vblendps_avx(auVar231,auVar8,8);
    auVar180 = vandps_avx(auVar180,auVar111);
    auVar178 = vandps_avx(auVar178,auVar111);
    auVar6 = vmaxps_avx(auVar180,auVar178);
    auVar180 = vandps_avx(auVar179,auVar111);
    auVar178 = vandps_avx(auVar5,auVar111);
    auVar180 = vmaxps_avx(auVar180,auVar178);
    auVar180 = vmaxps_avx(auVar6,auVar180);
    auVar178 = vmovshdup_avx(auVar180);
    auVar178 = vmaxss_avx(auVar178,auVar180);
    auVar180 = vshufpd_avx(auVar180,auVar180,1);
    auVar180 = vmaxss_avx(auVar180,auVar178);
    lVar106 = (long)iVar105;
    lVar108 = lVar106 * 0x44;
    auVar178 = vmovshdup_avx(auVar9);
    uVar109 = auVar178._0_8_;
    local_4a0._8_8_ = uVar109;
    local_4a0._0_8_ = uVar109;
    local_4a0._16_8_ = uVar109;
    local_4a0._24_8_ = uVar109;
    auVar179 = vmovshdup_avx(auVar10);
    uVar109 = auVar179._0_8_;
    local_520._8_8_ = uVar109;
    local_520._0_8_ = uVar109;
    local_520._16_8_ = uVar109;
    local_520._24_8_ = uVar109;
    auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar108 + 0x908);
    local_5e0._0_4_ = auVar197._0_4_;
    local_5e0._4_4_ = local_5e0._0_4_;
    local_5e0._8_4_ = local_5e0._0_4_;
    local_5e0._12_4_ = local_5e0._0_4_;
    local_5e0._16_4_ = local_5e0._0_4_;
    local_5e0._20_4_ = local_5e0._0_4_;
    local_5e0._24_4_ = local_5e0._0_4_;
    local_5e0._28_4_ = local_5e0._0_4_;
    auVar179 = vmovshdup_avx(auVar197);
    uVar109 = auVar179._0_8_;
    local_740._8_8_ = uVar109;
    local_740._0_8_ = uVar109;
    local_740._16_8_ = uVar109;
    local_740._24_8_ = uVar109;
    fVar157 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar108 + 0xd8c);
    auVar97 = *(undefined1 (*) [28])(bezier_basis0 + lVar108 + 0xd8c);
    auVar179 = vmovshdup_avx(auVar231);
    local_660 = auVar231._0_4_;
    auVar201._0_4_ = local_660 * fVar157;
    auVar201._4_4_ = local_660 * *(float *)(bezier_basis0 + lVar108 + 0xd90);
    auVar201._8_4_ = local_660 * *(float *)(bezier_basis0 + lVar108 + 0xd94);
    auVar201._12_4_ = local_660 * *(float *)(bezier_basis0 + lVar108 + 0xd98);
    auVar201._16_4_ = local_660 * *(float *)(bezier_basis0 + lVar108 + 0xd9c);
    auVar201._20_4_ = local_660 * *(float *)(bezier_basis0 + lVar108 + 0xda0);
    auVar201._24_4_ = local_660 * *(float *)(bezier_basis0 + lVar108 + 0xda4);
    auVar201._28_4_ = 0;
    auVar5 = vfmadd231ps_fma(auVar201,auVar126,local_5e0);
    local_640 = auVar179._0_4_;
    fStack_63c = auVar179._4_4_;
    auVar23._4_4_ = fStack_63c * *(float *)(bezier_basis0 + lVar108 + 0xd90);
    auVar23._0_4_ = local_640 * fVar157;
    auVar23._8_4_ = local_640 * *(float *)(bezier_basis0 + lVar108 + 0xd94);
    auVar23._12_4_ = fStack_63c * *(float *)(bezier_basis0 + lVar108 + 0xd98);
    auVar23._16_4_ = local_640 * *(float *)(bezier_basis0 + lVar108 + 0xd9c);
    auVar23._20_4_ = fStack_63c * *(float *)(bezier_basis0 + lVar108 + 0xda0);
    auVar23._24_4_ = local_640 * *(float *)(bezier_basis0 + lVar108 + 0xda4);
    auVar23._28_4_ = *(undefined4 *)(bezier_basis0 + lVar108 + 0xda8);
    auVar179 = vfmadd231ps_fma(auVar23,auVar126,local_740);
    auVar120 = *(undefined1 (*) [32])(bezier_basis0 + lVar108 + 0x484);
    local_6c0._0_4_ = auVar10._0_4_;
    local_6c0._4_4_ = local_6c0._0_4_;
    local_6c0._8_4_ = local_6c0._0_4_;
    local_6c0._12_4_ = local_6c0._0_4_;
    local_6c0._16_4_ = local_6c0._0_4_;
    local_6c0._20_4_ = local_6c0._0_4_;
    local_6c0._24_4_ = local_6c0._0_4_;
    local_6c0._28_4_ = local_6c0._0_4_;
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar120,local_6c0);
    auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar120,local_520);
    auVar145 = *(undefined1 (*) [32])(bezier_basis0 + lVar108);
    uVar107 = auVar9._0_4_;
    auVar230._4_4_ = uVar107;
    auVar230._0_4_ = uVar107;
    auVar230._8_4_ = uVar107;
    auVar230._12_4_ = uVar107;
    auVar230._16_4_ = uVar107;
    auVar230._20_4_ = uVar107;
    auVar230._24_4_ = uVar107;
    auVar230._28_4_ = uVar107;
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar145,auVar230);
    auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar145,local_4a0);
    auVar124 = *(undefined1 (*) [32])(bezier_basis1 + lVar108 + 0x908);
    fVar130 = *(float *)(bezier_basis1 + lVar108 + 0xd8c);
    fVar131 = *(float *)(bezier_basis1 + lVar108 + 0xd90);
    fVar132 = *(float *)(bezier_basis1 + lVar108 + 0xd94);
    fVar133 = *(float *)(bezier_basis1 + lVar108 + 0xd98);
    fVar134 = *(float *)(bezier_basis1 + lVar108 + 0xd9c);
    fVar84 = *(float *)(bezier_basis1 + lVar108 + 0xda0);
    fVar85 = *(float *)(bezier_basis1 + lVar108 + 0xda4);
    auVar24._4_4_ = local_660 * fVar131;
    auVar24._0_4_ = local_660 * fVar130;
    auVar24._8_4_ = local_660 * fVar132;
    auVar24._12_4_ = local_660 * fVar133;
    auVar24._16_4_ = local_660 * fVar134;
    auVar24._20_4_ = local_660 * fVar84;
    auVar24._24_4_ = local_660 * fVar85;
    auVar24._28_4_ = local_660;
    auVar6 = vfmadd231ps_fma(auVar24,auVar124,local_5e0);
    auVar25._4_4_ = fStack_63c * fVar131;
    auVar25._0_4_ = local_640 * fVar130;
    auVar25._8_4_ = local_640 * fVar132;
    auVar25._12_4_ = fStack_63c * fVar133;
    auVar25._16_4_ = local_640 * fVar134;
    auVar25._20_4_ = fStack_63c * fVar84;
    auVar25._24_4_ = local_640 * fVar85;
    auVar25._28_4_ = fStack_63c;
    auVar110 = vfmadd231ps_fma(auVar25,auVar124,local_740);
    auVar18 = *(undefined1 (*) [32])(bezier_basis1 + lVar108 + 0x484);
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar18,local_6c0);
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar18,local_520);
    auVar209 = *(undefined1 (*) [32])(bezier_basis1 + lVar108);
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar209,auVar230);
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar209,local_4a0);
    auVar113 = ZEXT1632(auVar6);
    local_320 = ZEXT1632(auVar5);
    auVar139 = vsubps_avx(auVar113,local_320);
    local_300 = ZEXT1632(auVar110);
    local_340 = ZEXT1632(auVar179);
    _local_360 = vsubps_avx(local_300,local_340);
    auVar114._0_4_ = auVar139._0_4_ * auVar179._0_4_;
    auVar114._4_4_ = auVar139._4_4_ * auVar179._4_4_;
    auVar114._8_4_ = auVar139._8_4_ * auVar179._8_4_;
    auVar114._12_4_ = auVar139._12_4_ * auVar179._12_4_;
    auVar114._16_4_ = auVar139._16_4_ * 0.0;
    auVar114._20_4_ = auVar139._20_4_ * 0.0;
    auVar114._24_4_ = auVar139._24_4_ * 0.0;
    auVar114._28_4_ = 0;
    fVar157 = local_360._0_4_;
    auVar141._0_4_ = auVar5._0_4_ * fVar157;
    fVar21 = local_360._4_4_;
    auVar141._4_4_ = auVar5._4_4_ * fVar21;
    fVar206 = local_360._8_4_;
    auVar141._8_4_ = auVar5._8_4_ * fVar206;
    fVar19 = local_360._12_4_;
    auVar141._12_4_ = auVar5._12_4_ * fVar19;
    fVar20 = local_360._16_4_;
    auVar141._16_4_ = fVar20 * 0.0;
    fVar156 = local_360._20_4_;
    auVar141._20_4_ = fVar156 * 0.0;
    fVar129 = local_360._24_4_;
    auVar141._24_4_ = fVar129 * 0.0;
    auVar141._28_4_ = 0;
    auVar123 = vsubps_avx(auVar114,auVar141);
    auVar5 = vpermilps_avx(auVar7,0xff);
    uVar109 = auVar5._0_8_;
    local_a0._8_8_ = uVar109;
    local_a0._0_8_ = uVar109;
    local_a0._16_8_ = uVar109;
    local_a0._24_8_ = uVar109;
    auVar179 = vpermilps_avx(auVar158,0xff);
    uVar109 = auVar179._0_8_;
    local_c0._8_8_ = uVar109;
    local_c0._0_8_ = uVar109;
    local_c0._16_8_ = uVar109;
    local_c0._24_8_ = uVar109;
    auVar179 = vshufps_avx(local_7c0,local_7c0,0xff);
    uVar109 = auVar179._0_8_;
    auVar233._8_8_ = uVar109;
    auVar233._0_8_ = uVar109;
    auVar233._16_8_ = uVar109;
    auVar233._24_8_ = uVar109;
    auVar179 = vpermilps_avx(auVar8,0xff);
    local_e0 = auVar179._0_8_;
    local_8e0 = auVar97._0_4_;
    fStack_8dc = auVar97._4_4_;
    fStack_8d8 = auVar97._8_4_;
    fStack_8d4 = auVar97._12_4_;
    fStack_8d0 = auVar97._16_4_;
    fStack_8cc = auVar97._20_4_;
    fStack_8c8 = auVar97._24_4_;
    fVar135 = auVar179._0_4_;
    auVar202._0_4_ = fVar135 * local_8e0;
    fVar155 = auVar179._4_4_;
    auVar202._4_4_ = fVar155 * fStack_8dc;
    auVar202._8_4_ = fVar135 * fStack_8d8;
    auVar202._12_4_ = fVar155 * fStack_8d4;
    auVar202._16_4_ = fVar135 * fStack_8d0;
    auVar202._20_4_ = fVar155 * fStack_8cc;
    auVar202._24_4_ = fVar135 * fStack_8c8;
    auVar202._28_4_ = 0;
    auVar179 = vfmadd231ps_fma(auVar202,auVar233,auVar126);
    auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar120,local_c0);
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar145,local_a0);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    auVar26._4_4_ = fVar155 * fVar131;
    auVar26._0_4_ = fVar135 * fVar130;
    auVar26._8_4_ = fVar135 * fVar132;
    auVar26._12_4_ = fVar155 * fVar133;
    auVar26._16_4_ = fVar135 * fVar134;
    auVar26._20_4_ = fVar155 * fVar84;
    auVar26._24_4_ = fVar135 * fVar85;
    auVar26._28_4_ = auVar145._28_4_;
    auVar179 = vfmadd231ps_fma(auVar26,auVar124,auVar233);
    auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar18,local_c0);
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar209,local_a0);
    auVar27._4_4_ = fVar21 * fVar21;
    auVar27._0_4_ = fVar157 * fVar157;
    auVar27._8_4_ = fVar206 * fVar206;
    auVar27._12_4_ = fVar19 * fVar19;
    auVar27._16_4_ = fVar20 * fVar20;
    auVar27._20_4_ = fVar156 * fVar156;
    auVar27._24_4_ = fVar129 * fVar129;
    auVar27._28_4_ = auVar5._4_4_;
    auVar179 = vfmadd231ps_fma(auVar27,auVar139,auVar139);
    auVar112 = vmaxps_avx(ZEXT1632(auVar6),ZEXT1632(auVar110));
    auVar28._4_4_ = auVar112._4_4_ * auVar112._4_4_ * auVar179._4_4_;
    auVar28._0_4_ = auVar112._0_4_ * auVar112._0_4_ * auVar179._0_4_;
    auVar28._8_4_ = auVar112._8_4_ * auVar112._8_4_ * auVar179._8_4_;
    auVar28._12_4_ = auVar112._12_4_ * auVar112._12_4_ * auVar179._12_4_;
    auVar28._16_4_ = auVar112._16_4_ * auVar112._16_4_ * 0.0;
    auVar28._20_4_ = auVar112._20_4_ * auVar112._20_4_ * 0.0;
    auVar28._24_4_ = auVar112._24_4_ * auVar112._24_4_ * 0.0;
    auVar28._28_4_ = auVar112._28_4_;
    auVar29._4_4_ = auVar123._4_4_ * auVar123._4_4_;
    auVar29._0_4_ = auVar123._0_4_ * auVar123._0_4_;
    auVar29._8_4_ = auVar123._8_4_ * auVar123._8_4_;
    auVar29._12_4_ = auVar123._12_4_ * auVar123._12_4_;
    auVar29._16_4_ = auVar123._16_4_ * auVar123._16_4_;
    auVar29._20_4_ = auVar123._20_4_ * auVar123._20_4_;
    auVar29._24_4_ = auVar123._24_4_ * auVar123._24_4_;
    auVar29._28_4_ = auVar123._28_4_;
    local_4c0._0_4_ = (undefined4)iVar105;
    local_4c0._4_12_ = auVar231._4_12_;
    auVar112 = vcmpps_avx(auVar29,auVar28,2);
    fVar157 = auVar180._0_4_ * 4.7683716e-07;
    local_4c0._16_16_ = auVar115._16_16_;
    auVar115._4_4_ = local_4c0._0_4_;
    auVar115._0_4_ = local_4c0._0_4_;
    auVar115._8_4_ = local_4c0._0_4_;
    auVar115._12_4_ = local_4c0._0_4_;
    auVar115._16_4_ = local_4c0._0_4_;
    auVar115._20_4_ = local_4c0._0_4_;
    auVar115._24_4_ = local_4c0._0_4_;
    auVar115._28_4_ = local_4c0._0_4_;
    auVar115 = vcmpps_avx(_DAT_01f7b060,auVar115,1);
    auVar180 = vpermilps_avx(auVar9,0xaa);
    uVar109 = auVar180._0_8_;
    auVar228._8_8_ = uVar109;
    auVar228._0_8_ = uVar109;
    auVar228._16_8_ = uVar109;
    auVar228._24_8_ = uVar109;
    auVar180 = vpermilps_avx(auVar10,0xaa);
    uVar109 = auVar180._0_8_;
    local_500._8_8_ = uVar109;
    local_500._0_8_ = uVar109;
    local_500._16_8_ = uVar109;
    local_500._24_8_ = uVar109;
    auVar179 = vpermilps_avx(auVar197,0xaa);
    uVar109 = auVar179._0_8_;
    auVar218._8_8_ = uVar109;
    auVar218._0_8_ = uVar109;
    auVar218._16_8_ = uVar109;
    auVar218._24_8_ = uVar109;
    auVar180 = vshufps_avx(auVar231,auVar231,0xaa);
    uVar109 = auVar180._0_8_;
    register0x00001508 = uVar109;
    local_6e0 = uVar109;
    register0x00001510 = uVar109;
    register0x00001518 = uVar109;
    auVar225 = ZEXT3264(_local_6e0);
    auVar123 = auVar115 & auVar112;
    uVar102 = *(uint *)(ray + k * 4 + 0x30);
    local_680._0_16_ = ZEXT416(uVar102);
    local_4e0._0_16_ = ZEXT416(uVar99);
    local_690 = ZEXT416(uVar12);
    local_810 = auVar7._0_8_;
    uStack_808 = auVar7._8_8_;
    local_830 = auVar158._0_8_;
    uStack_828 = auVar158._8_8_;
    local_820._0_4_ = auVar8._0_4_;
    fVar21 = (float)local_820;
    local_820._4_4_ = auVar8._4_4_;
    fVar206 = local_820._4_4_;
    uStack_818._0_4_ = auVar8._8_4_;
    fVar19 = (float)uStack_818;
    uStack_818._4_4_ = auVar8._12_4_;
    fVar20 = uStack_818._4_4_;
    local_820 = auVar8._0_8_;
    uStack_818 = auVar8._8_8_;
    fStack_65c = local_660;
    fStack_658 = local_660;
    fStack_654 = local_660;
    fStack_650 = local_660;
    fStack_64c = local_660;
    fStack_648 = local_660;
    fStack_644 = local_660;
    fStack_638 = local_640;
    fStack_634 = fStack_63c;
    fStack_630 = local_640;
    fStack_62c = fStack_63c;
    fStack_628 = local_640;
    fStack_624 = fStack_63c;
    local_690._0_4_ = uVar12;
    if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar123 >> 0x7f,0) == '\0') &&
          (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar123 >> 0xbf,0) == '\0') &&
        (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar123[0x1f])
    {
      auVar154 = ZEXT3264(local_700);
      auVar183 = ZEXT3264(local_5e0);
      auVar235 = ZEXT3264(local_740);
      auVar215 = ZEXT3264(local_6c0);
    }
    else {
      local_380 = vandps_avx(auVar112,auVar115);
      fVar135 = auVar180._0_4_;
      fVar155 = auVar180._4_4_;
      auVar30._4_4_ = fVar155 * fVar131;
      auVar30._0_4_ = fVar135 * fVar130;
      auVar30._8_4_ = fVar135 * fVar132;
      auVar30._12_4_ = fVar155 * fVar133;
      auVar30._16_4_ = fVar135 * fVar134;
      auVar30._20_4_ = fVar155 * fVar84;
      auVar30._24_4_ = fVar135 * fVar85;
      auVar30._28_4_ = local_380._28_4_;
      auVar180 = vfmadd213ps_fma(auVar124,auVar218,auVar30);
      auVar180 = vfmadd213ps_fma(auVar18,local_500,ZEXT1632(auVar180));
      auVar180 = vfmadd213ps_fma(auVar209,auVar228,ZEXT1632(auVar180));
      auVar116._0_4_ = fVar135 * local_8e0;
      auVar116._4_4_ = fVar155 * fStack_8dc;
      auVar116._8_4_ = fVar135 * fStack_8d8;
      auVar116._12_4_ = fVar155 * fStack_8d4;
      auVar116._16_4_ = fVar135 * fStack_8d0;
      auVar116._20_4_ = fVar155 * fStack_8cc;
      auVar116._24_4_ = fVar135 * fStack_8c8;
      auVar116._28_4_ = 0;
      auVar5 = vfmadd213ps_fma(auVar126,auVar218,auVar116);
      auVar5 = vfmadd213ps_fma(auVar120,local_500,ZEXT1632(auVar5));
      auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar108 + 0x1210);
      auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar108 + 0x1694);
      auVar120 = *(undefined1 (*) [32])(bezier_basis0 + lVar108 + 0x1b18);
      fVar156 = *(float *)(bezier_basis0 + lVar108 + 0x1f9c);
      fVar129 = *(float *)(bezier_basis0 + lVar108 + 0x1fa0);
      fVar130 = *(float *)(bezier_basis0 + lVar108 + 0x1fa4);
      fVar131 = *(float *)(bezier_basis0 + lVar108 + 0x1fa8);
      fVar132 = *(float *)(bezier_basis0 + lVar108 + 0x1fac);
      fVar133 = *(float *)(bezier_basis0 + lVar108 + 0x1fb0);
      fVar134 = *(float *)(bezier_basis0 + lVar108 + 0x1fb4);
      auVar31._4_4_ = local_660 * fVar129;
      auVar31._0_4_ = local_660 * fVar156;
      auVar31._8_4_ = local_660 * fVar130;
      auVar31._12_4_ = local_660 * fVar131;
      auVar31._16_4_ = local_660 * fVar132;
      auVar31._20_4_ = local_660 * fVar133;
      auVar31._24_4_ = local_660 * fVar134;
      auVar31._28_4_ = *(undefined4 *)(bezier_basis1 + lVar108 + 0xda8);
      auVar32._4_4_ = fStack_63c * fVar129;
      auVar32._0_4_ = local_640 * fVar156;
      auVar32._8_4_ = local_640 * fVar130;
      auVar32._12_4_ = fStack_63c * fVar131;
      auVar32._16_4_ = local_640 * fVar132;
      auVar32._20_4_ = fStack_63c * fVar133;
      auVar32._24_4_ = local_640 * fVar134;
      auVar32._28_4_ = auVar178._4_4_;
      auVar33._4_4_ = fVar129 * fVar155;
      auVar33._0_4_ = fVar156 * fVar135;
      auVar33._8_4_ = fVar130 * fVar135;
      auVar33._12_4_ = fVar131 * fVar155;
      auVar33._16_4_ = fVar132 * fVar135;
      auVar33._20_4_ = fVar133 * fVar155;
      auVar33._24_4_ = fVar134 * fVar135;
      auVar33._28_4_ = auVar179._4_4_;
      auVar178 = vfmadd231ps_fma(auVar31,auVar120,local_5e0);
      auVar8 = vfmadd231ps_fma(auVar32,auVar120,local_740);
      auVar9 = vfmadd231ps_fma(auVar33,auVar218,auVar120);
      auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),auVar126,local_6c0);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar126,local_520);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),local_500,auVar126);
      auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),auVar115,auVar230);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar115,local_4a0);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar115,auVar228);
      fVar156 = *(float *)(bezier_basis1 + lVar108 + 0x1f9c);
      fVar129 = *(float *)(bezier_basis1 + lVar108 + 0x1fa0);
      fVar130 = *(float *)(bezier_basis1 + lVar108 + 0x1fa4);
      fVar131 = *(float *)(bezier_basis1 + lVar108 + 0x1fa8);
      fVar132 = *(float *)(bezier_basis1 + lVar108 + 0x1fac);
      fVar133 = *(float *)(bezier_basis1 + lVar108 + 0x1fb0);
      fVar134 = *(float *)(bezier_basis1 + lVar108 + 0x1fb4);
      auVar34._4_4_ = local_660 * fVar129;
      auVar34._0_4_ = local_660 * fVar156;
      auVar34._8_4_ = local_660 * fVar130;
      auVar34._12_4_ = local_660 * fVar131;
      auVar34._16_4_ = local_660 * fVar132;
      auVar34._20_4_ = local_660 * fVar133;
      auVar34._24_4_ = local_660 * fVar134;
      auVar34._28_4_ = local_660;
      auVar35._4_4_ = fStack_63c * fVar129;
      auVar35._0_4_ = local_640 * fVar156;
      auVar35._8_4_ = local_640 * fVar130;
      auVar35._12_4_ = fStack_63c * fVar131;
      auVar35._16_4_ = local_640 * fVar132;
      auVar35._20_4_ = fStack_63c * fVar133;
      auVar35._24_4_ = local_640 * fVar134;
      auVar35._28_4_ = fStack_63c;
      auVar36._4_4_ = fVar129 * fVar155;
      auVar36._0_4_ = fVar156 * fVar135;
      auVar36._8_4_ = fVar130 * fVar135;
      auVar36._12_4_ = fVar131 * fVar155;
      auVar36._16_4_ = fVar132 * fVar135;
      auVar36._20_4_ = fVar133 * fVar155;
      auVar36._24_4_ = fVar134 * fVar135;
      auVar36._28_4_ = auVar179._4_4_;
      auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar108 + 0x1b18);
      auVar179 = vfmadd231ps_fma(auVar34,auVar115,local_5e0);
      auVar10 = vfmadd231ps_fma(auVar35,auVar115,local_740);
      auVar197 = vfmadd231ps_fma(auVar36,auVar218,auVar115);
      auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar108 + 0x1694);
      auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar115,local_6c0);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar115,local_520);
      auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar115,local_500);
      auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar108 + 0x1210);
      auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar115,auVar230);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar115,local_4a0);
      auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar228,auVar115);
      auVar115 = vandps_avx(local_180,ZEXT1632(auVar178));
      auVar126 = vandps_avx(ZEXT1632(auVar8),local_180);
      auVar126 = vmaxps_avx(auVar115,auVar126);
      auVar115 = vandps_avx(ZEXT1632(auVar9),local_180);
      auVar115 = vmaxps_avx(auVar126,auVar115);
      auVar142._4_4_ = fVar157;
      auVar142._0_4_ = fVar157;
      auVar142._8_4_ = fVar157;
      auVar142._12_4_ = fVar157;
      auVar142._16_4_ = fVar157;
      auVar142._20_4_ = fVar157;
      auVar142._24_4_ = fVar157;
      auVar142._28_4_ = fVar157;
      auVar115 = vcmpps_avx(auVar115,auVar142,1);
      auVar120 = vblendvps_avx(ZEXT1632(auVar178),auVar139,auVar115);
      auVar124 = vblendvps_avx(ZEXT1632(auVar8),_local_360,auVar115);
      auVar115 = vandps_avx(ZEXT1632(auVar179),local_180);
      auVar126 = vandps_avx(ZEXT1632(auVar10),local_180);
      auVar126 = vmaxps_avx(auVar115,auVar126);
      auVar115 = vandps_avx(ZEXT1632(auVar197),local_180);
      auVar115 = vmaxps_avx(auVar126,auVar115);
      auVar126 = vcmpps_avx(auVar115,auVar142,1);
      auVar115 = vblendvps_avx(ZEXT1632(auVar179),auVar139,auVar126);
      auVar126 = vblendvps_avx(ZEXT1632(auVar10),_local_360,auVar126);
      auVar178 = vfmadd213ps_fma(auVar145,auVar228,ZEXT1632(auVar5));
      auVar179 = vfmadd213ps_fma(auVar120,auVar120,ZEXT832(0) << 0x20);
      auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar124,auVar124);
      auVar145 = vrsqrtps_avx(ZEXT1632(auVar179));
      fVar156 = auVar145._0_4_;
      fVar129 = auVar145._4_4_;
      fVar130 = auVar145._8_4_;
      fVar131 = auVar145._12_4_;
      fVar132 = auVar145._16_4_;
      fVar133 = auVar145._20_4_;
      fVar134 = auVar145._24_4_;
      auVar37._4_4_ = fVar129 * fVar129 * fVar129 * auVar179._4_4_ * -0.5;
      auVar37._0_4_ = fVar156 * fVar156 * fVar156 * auVar179._0_4_ * -0.5;
      auVar37._8_4_ = fVar130 * fVar130 * fVar130 * auVar179._8_4_ * -0.5;
      auVar37._12_4_ = fVar131 * fVar131 * fVar131 * auVar179._12_4_ * -0.5;
      auVar37._16_4_ = fVar132 * fVar132 * fVar132 * -0.0;
      auVar37._20_4_ = fVar133 * fVar133 * fVar133 * -0.0;
      auVar37._24_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar37._28_4_ = 0;
      auVar229._8_4_ = 0x3fc00000;
      auVar229._0_8_ = 0x3fc000003fc00000;
      auVar229._12_4_ = 0x3fc00000;
      auVar229._16_4_ = 0x3fc00000;
      auVar229._20_4_ = 0x3fc00000;
      auVar229._24_4_ = 0x3fc00000;
      auVar229._28_4_ = 0x3fc00000;
      auVar179 = vfmadd231ps_fma(auVar37,auVar229,auVar145);
      fVar156 = auVar179._0_4_;
      fVar129 = auVar179._4_4_;
      auVar38._4_4_ = auVar124._4_4_ * fVar129;
      auVar38._0_4_ = auVar124._0_4_ * fVar156;
      fVar130 = auVar179._8_4_;
      auVar38._8_4_ = auVar124._8_4_ * fVar130;
      fVar131 = auVar179._12_4_;
      auVar38._12_4_ = auVar124._12_4_ * fVar131;
      auVar38._16_4_ = auVar124._16_4_ * 0.0;
      auVar38._20_4_ = auVar124._20_4_ * 0.0;
      auVar38._24_4_ = auVar124._24_4_ * 0.0;
      auVar38._28_4_ = auVar145._28_4_;
      auVar39._4_4_ = -auVar120._4_4_ * fVar129;
      auVar39._0_4_ = -auVar120._0_4_ * fVar156;
      auVar39._8_4_ = -auVar120._8_4_ * fVar130;
      auVar39._12_4_ = -auVar120._12_4_ * fVar131;
      auVar39._16_4_ = -auVar120._16_4_ * 0.0;
      auVar39._20_4_ = -auVar120._20_4_ * 0.0;
      auVar39._24_4_ = -auVar120._24_4_ * 0.0;
      auVar39._28_4_ = auVar139._28_4_;
      auVar179 = vfmadd213ps_fma(auVar115,auVar115,ZEXT832(0) << 0x20);
      auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar126,auVar126);
      auVar120 = vrsqrtps_avx(ZEXT1632(auVar179));
      auVar145 = ZEXT1632(CONCAT412(fVar131 * 0.0,
                                    CONCAT48(fVar130 * 0.0,CONCAT44(fVar129 * 0.0,fVar156 * 0.0))));
      fVar156 = auVar120._0_4_;
      fVar129 = auVar120._4_4_;
      fVar130 = auVar120._8_4_;
      fVar131 = auVar120._12_4_;
      fVar132 = auVar120._16_4_;
      fVar133 = auVar120._20_4_;
      fVar134 = auVar120._24_4_;
      auVar40._4_4_ = fVar129 * fVar129 * fVar129 * auVar179._4_4_ * -0.5;
      auVar40._0_4_ = fVar156 * fVar156 * fVar156 * auVar179._0_4_ * -0.5;
      auVar40._8_4_ = fVar130 * fVar130 * fVar130 * auVar179._8_4_ * -0.5;
      auVar40._12_4_ = fVar131 * fVar131 * fVar131 * auVar179._12_4_ * -0.5;
      auVar40._16_4_ = fVar132 * fVar132 * fVar132 * -0.0;
      auVar40._20_4_ = fVar133 * fVar133 * fVar133 * -0.0;
      auVar40._24_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar40._28_4_ = 0xbf000000;
      auVar179 = vfmadd231ps_fma(auVar40,auVar229,auVar120);
      fVar156 = auVar179._0_4_;
      fVar129 = auVar179._4_4_;
      auVar41._4_4_ = fVar129 * auVar126._4_4_;
      auVar41._0_4_ = fVar156 * auVar126._0_4_;
      fVar130 = auVar179._8_4_;
      auVar41._8_4_ = fVar130 * auVar126._8_4_;
      fVar131 = auVar179._12_4_;
      auVar41._12_4_ = fVar131 * auVar126._12_4_;
      auVar41._16_4_ = auVar126._16_4_ * 0.0;
      auVar41._20_4_ = auVar126._20_4_ * 0.0;
      auVar41._24_4_ = auVar126._24_4_ * 0.0;
      auVar41._28_4_ = 0;
      auVar42._4_4_ = fVar129 * -auVar115._4_4_;
      auVar42._0_4_ = fVar156 * -auVar115._0_4_;
      auVar42._8_4_ = fVar130 * -auVar115._8_4_;
      auVar42._12_4_ = fVar131 * -auVar115._12_4_;
      auVar42._16_4_ = -auVar115._16_4_ * 0.0;
      auVar42._20_4_ = -auVar115._20_4_ * 0.0;
      auVar42._24_4_ = -auVar115._24_4_ * 0.0;
      auVar42._28_4_ = 0x3fc00000;
      auVar43._28_4_ = auVar120._28_4_;
      auVar43._0_28_ =
           ZEXT1628(CONCAT412(fVar131 * 0.0,
                              CONCAT48(fVar130 * 0.0,CONCAT44(fVar129 * 0.0,fVar156 * 0.0))));
      auVar179 = vfmadd213ps_fma(auVar38,ZEXT1632(auVar6),local_320);
      auVar115 = ZEXT1632(auVar6);
      auVar5 = vfmadd213ps_fma(auVar39,auVar115,local_340);
      auVar8 = vfmadd213ps_fma(auVar145,auVar115,ZEXT1632(auVar178));
      auVar197 = vfnmadd213ps_fma(auVar38,auVar115,local_320);
      auVar9 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar110),auVar113);
      auVar231 = vfnmadd213ps_fma(auVar39,auVar115,local_340);
      auVar187 = ZEXT1632(auVar110);
      auVar10 = vfmadd213ps_fma(auVar42,auVar187,local_300);
      auVar186 = ZEXT1632(auVar6);
      auVar136 = vfnmadd231ps_fma(ZEXT1632(auVar178),auVar186,auVar145);
      auVar178 = vfmadd213ps_fma(auVar43,auVar187,ZEXT1632(auVar180));
      auVar110 = vfnmadd213ps_fma(auVar41,auVar187,auVar113);
      auVar111 = vfnmadd213ps_fma(auVar42,auVar187,local_300);
      auVar159 = vfnmadd231ps_fma(ZEXT1632(auVar180),auVar187,auVar43);
      auVar115 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar231));
      auVar126 = vsubps_avx(ZEXT1632(auVar178),ZEXT1632(auVar136));
      auVar169._0_4_ = auVar136._0_4_ * auVar115._0_4_;
      auVar169._4_4_ = auVar136._4_4_ * auVar115._4_4_;
      auVar169._8_4_ = auVar136._8_4_ * auVar115._8_4_;
      auVar169._12_4_ = auVar136._12_4_ * auVar115._12_4_;
      auVar169._16_4_ = auVar115._16_4_ * 0.0;
      auVar169._20_4_ = auVar115._20_4_ * 0.0;
      auVar169._24_4_ = auVar115._24_4_ * 0.0;
      auVar169._28_4_ = 0;
      auVar6 = vfmsub231ps_fma(auVar169,ZEXT1632(auVar231),auVar126);
      auVar44._4_4_ = auVar197._4_4_ * auVar126._4_4_;
      auVar44._0_4_ = auVar197._0_4_ * auVar126._0_4_;
      auVar44._8_4_ = auVar197._8_4_ * auVar126._8_4_;
      auVar44._12_4_ = auVar197._12_4_ * auVar126._12_4_;
      auVar44._16_4_ = auVar126._16_4_ * 0.0;
      auVar44._20_4_ = auVar126._20_4_ * 0.0;
      auVar44._24_4_ = auVar126._24_4_ * 0.0;
      auVar44._28_4_ = auVar126._28_4_;
      auVar209 = ZEXT1632(auVar197);
      auVar126 = vsubps_avx(ZEXT1632(auVar9),auVar209);
      auVar180 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar136),auVar126);
      auVar45._4_4_ = auVar231._4_4_ * auVar126._4_4_;
      auVar45._0_4_ = auVar231._0_4_ * auVar126._0_4_;
      auVar45._8_4_ = auVar231._8_4_ * auVar126._8_4_;
      auVar45._12_4_ = auVar231._12_4_ * auVar126._12_4_;
      auVar45._16_4_ = auVar126._16_4_ * 0.0;
      auVar45._20_4_ = auVar126._20_4_ * 0.0;
      auVar45._24_4_ = auVar126._24_4_ * 0.0;
      auVar45._28_4_ = auVar126._28_4_;
      auVar197 = vfmsub231ps_fma(auVar45,auVar209,auVar115);
      auVar180 = vfmadd231ps_fma(ZEXT1632(auVar197),ZEXT832(0) << 0x20,ZEXT1632(auVar180));
      auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),ZEXT832(0) << 0x20,ZEXT1632(auVar6));
      auVar123 = vcmpps_avx(ZEXT1632(auVar180),ZEXT832(0) << 0x20,2);
      auVar115 = vblendvps_avx(ZEXT1632(auVar110),ZEXT1632(auVar179),auVar123);
      auVar126 = vblendvps_avx(ZEXT1632(auVar111),ZEXT1632(auVar5),auVar123);
      auVar120 = vblendvps_avx(ZEXT1632(auVar159),ZEXT1632(auVar8),auVar123);
      auVar145 = vblendvps_avx(auVar209,ZEXT1632(auVar9),auVar123);
      auVar124 = vblendvps_avx(ZEXT1632(auVar231),ZEXT1632(auVar10),auVar123);
      auVar18 = vblendvps_avx(ZEXT1632(auVar136),ZEXT1632(auVar178),auVar123);
      auVar209 = vblendvps_avx(ZEXT1632(auVar9),auVar209,auVar123);
      auVar112 = vblendvps_avx(ZEXT1632(auVar10),ZEXT1632(auVar231),auVar123);
      auVar180 = vpackssdw_avx(local_380._0_16_,local_380._16_16_);
      auVar139 = vblendvps_avx(ZEXT1632(auVar178),ZEXT1632(auVar136),auVar123);
      auVar113 = vsubps_avx(auVar209,auVar115);
      auVar112 = vsubps_avx(auVar112,auVar126);
      auVar234 = vsubps_avx(auVar139,auVar120);
      auVar22 = vsubps_avx(auVar115,auVar145);
      auVar140 = vsubps_avx(auVar126,auVar124);
      auVar168 = vsubps_avx(auVar120,auVar18);
      auVar46._4_4_ = auVar234._4_4_ * auVar115._4_4_;
      auVar46._0_4_ = auVar234._0_4_ * auVar115._0_4_;
      auVar46._8_4_ = auVar234._8_4_ * auVar115._8_4_;
      auVar46._12_4_ = auVar234._12_4_ * auVar115._12_4_;
      auVar46._16_4_ = auVar234._16_4_ * auVar115._16_4_;
      auVar46._20_4_ = auVar234._20_4_ * auVar115._20_4_;
      auVar46._24_4_ = auVar234._24_4_ * auVar115._24_4_;
      auVar46._28_4_ = auVar139._28_4_;
      auVar178 = vfmsub231ps_fma(auVar46,auVar120,auVar113);
      auVar47._4_4_ = auVar113._4_4_ * auVar126._4_4_;
      auVar47._0_4_ = auVar113._0_4_ * auVar126._0_4_;
      auVar47._8_4_ = auVar113._8_4_ * auVar126._8_4_;
      auVar47._12_4_ = auVar113._12_4_ * auVar126._12_4_;
      auVar47._16_4_ = auVar113._16_4_ * auVar126._16_4_;
      auVar47._20_4_ = auVar113._20_4_ * auVar126._20_4_;
      auVar47._24_4_ = auVar113._24_4_ * auVar126._24_4_;
      auVar47._28_4_ = auVar209._28_4_;
      auVar179 = vfmsub231ps_fma(auVar47,auVar115,auVar112);
      auVar178 = vfmadd231ps_fma(ZEXT1632(auVar179),ZEXT832(0) << 0x20,ZEXT1632(auVar178));
      auVar117._0_4_ = auVar112._0_4_ * auVar120._0_4_;
      auVar117._4_4_ = auVar112._4_4_ * auVar120._4_4_;
      auVar117._8_4_ = auVar112._8_4_ * auVar120._8_4_;
      auVar117._12_4_ = auVar112._12_4_ * auVar120._12_4_;
      auVar117._16_4_ = auVar112._16_4_ * auVar120._16_4_;
      auVar117._20_4_ = auVar112._20_4_ * auVar120._20_4_;
      auVar117._24_4_ = auVar112._24_4_ * auVar120._24_4_;
      auVar117._28_4_ = 0;
      auVar179 = vfmsub231ps_fma(auVar117,auVar126,auVar234);
      auVar179 = vfmadd231ps_fma(ZEXT1632(auVar178),ZEXT832(0) << 0x20,ZEXT1632(auVar179));
      auVar118._0_4_ = auVar168._0_4_ * auVar145._0_4_;
      auVar118._4_4_ = auVar168._4_4_ * auVar145._4_4_;
      auVar118._8_4_ = auVar168._8_4_ * auVar145._8_4_;
      auVar118._12_4_ = auVar168._12_4_ * auVar145._12_4_;
      auVar118._16_4_ = auVar168._16_4_ * auVar145._16_4_;
      auVar118._20_4_ = auVar168._20_4_ * auVar145._20_4_;
      auVar118._24_4_ = auVar168._24_4_ * auVar145._24_4_;
      auVar118._28_4_ = 0;
      auVar178 = vfmsub231ps_fma(auVar118,auVar22,auVar18);
      auVar48._4_4_ = auVar140._4_4_ * auVar18._4_4_;
      auVar48._0_4_ = auVar140._0_4_ * auVar18._0_4_;
      auVar48._8_4_ = auVar140._8_4_ * auVar18._8_4_;
      auVar48._12_4_ = auVar140._12_4_ * auVar18._12_4_;
      auVar48._16_4_ = auVar140._16_4_ * auVar18._16_4_;
      auVar48._20_4_ = auVar140._20_4_ * auVar18._20_4_;
      auVar48._24_4_ = auVar140._24_4_ * auVar18._24_4_;
      auVar48._28_4_ = auVar18._28_4_;
      auVar5 = vfmsub231ps_fma(auVar48,auVar124,auVar168);
      auVar49._4_4_ = auVar22._4_4_ * auVar124._4_4_;
      auVar49._0_4_ = auVar22._0_4_ * auVar124._0_4_;
      auVar49._8_4_ = auVar22._8_4_ * auVar124._8_4_;
      auVar49._12_4_ = auVar22._12_4_ * auVar124._12_4_;
      auVar49._16_4_ = auVar22._16_4_ * auVar124._16_4_;
      auVar49._20_4_ = auVar22._20_4_ * auVar124._20_4_;
      auVar49._24_4_ = auVar22._24_4_ * auVar124._24_4_;
      auVar49._28_4_ = auVar124._28_4_;
      auVar6 = vfmsub231ps_fma(auVar49,auVar140,auVar145);
      auVar178 = vfmadd231ps_fma(ZEXT1632(auVar6),ZEXT832(0) << 0x20,ZEXT1632(auVar178));
      auVar5 = vfmadd231ps_fma(ZEXT1632(auVar178),ZEXT832(0) << 0x20,ZEXT1632(auVar5));
      auVar145 = vmaxps_avx(ZEXT1632(auVar179),ZEXT1632(auVar5));
      auVar145 = vcmpps_avx(auVar145,ZEXT832(0) << 0x20,2);
      auVar178 = vpackssdw_avx(auVar145._0_16_,auVar145._16_16_);
      auVar180 = vpand_avx(auVar180,auVar178);
      auVar145 = vpmovsxwd_avx2(auVar180);
      if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar145 >> 0x7f,0) == '\0') &&
            (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar145 >> 0xbf,0) == '\0') &&
          (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar145[0x1f]) {
LAB_01435b7c:
        auVar189._8_8_ = uStack_578;
        auVar189._0_8_ = local_580;
        auVar189._16_8_ = uStack_570;
        auVar189._24_8_ = uStack_568;
      }
      else {
        auVar50._4_4_ = auVar112._4_4_ * auVar168._4_4_;
        auVar50._0_4_ = auVar112._0_4_ * auVar168._0_4_;
        auVar50._8_4_ = auVar112._8_4_ * auVar168._8_4_;
        auVar50._12_4_ = auVar112._12_4_ * auVar168._12_4_;
        auVar50._16_4_ = auVar112._16_4_ * auVar168._16_4_;
        auVar50._20_4_ = auVar112._20_4_ * auVar168._20_4_;
        auVar50._24_4_ = auVar112._24_4_ * auVar168._24_4_;
        auVar50._28_4_ = auVar145._28_4_;
        auVar9 = vfmsub231ps_fma(auVar50,auVar140,auVar234);
        auVar143._0_4_ = auVar22._0_4_ * auVar234._0_4_;
        auVar143._4_4_ = auVar22._4_4_ * auVar234._4_4_;
        auVar143._8_4_ = auVar22._8_4_ * auVar234._8_4_;
        auVar143._12_4_ = auVar22._12_4_ * auVar234._12_4_;
        auVar143._16_4_ = auVar22._16_4_ * auVar234._16_4_;
        auVar143._20_4_ = auVar22._20_4_ * auVar234._20_4_;
        auVar143._24_4_ = auVar22._24_4_ * auVar234._24_4_;
        auVar143._28_4_ = 0;
        auVar8 = vfmsub231ps_fma(auVar143,auVar113,auVar168);
        auVar51._4_4_ = auVar113._4_4_ * auVar140._4_4_;
        auVar51._0_4_ = auVar113._0_4_ * auVar140._0_4_;
        auVar51._8_4_ = auVar113._8_4_ * auVar140._8_4_;
        auVar51._12_4_ = auVar113._12_4_ * auVar140._12_4_;
        auVar51._16_4_ = auVar113._16_4_ * auVar140._16_4_;
        auVar51._20_4_ = auVar113._20_4_ * auVar140._20_4_;
        auVar51._24_4_ = auVar113._24_4_ * auVar140._24_4_;
        auVar51._28_4_ = auVar113._28_4_;
        auVar10 = vfmsub231ps_fma(auVar51,auVar22,auVar112);
        auVar178 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar8),ZEXT1632(auVar10));
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar178),ZEXT1632(auVar9),_DAT_01f7b000);
        auVar145 = vrcpps_avx(ZEXT1632(auVar6));
        auVar220._8_4_ = 0x3f800000;
        auVar220._0_8_ = 0x3f8000003f800000;
        auVar220._12_4_ = 0x3f800000;
        auVar220._16_4_ = 0x3f800000;
        auVar220._20_4_ = 0x3f800000;
        auVar220._24_4_ = 0x3f800000;
        auVar220._28_4_ = 0x3f800000;
        auVar178 = vfnmadd213ps_fma(auVar145,ZEXT1632(auVar6),auVar220);
        auVar178 = vfmadd132ps_fma(ZEXT1632(auVar178),auVar145,auVar145);
        auVar52._4_4_ = auVar10._4_4_ * auVar120._4_4_;
        auVar52._0_4_ = auVar10._0_4_ * auVar120._0_4_;
        auVar52._8_4_ = auVar10._8_4_ * auVar120._8_4_;
        auVar52._12_4_ = auVar10._12_4_ * auVar120._12_4_;
        auVar52._16_4_ = auVar120._16_4_ * 0.0;
        auVar52._20_4_ = auVar120._20_4_ * 0.0;
        auVar52._24_4_ = auVar120._24_4_ * 0.0;
        auVar52._28_4_ = auVar120._28_4_;
        auVar8 = vfmadd231ps_fma(auVar52,auVar126,ZEXT1632(auVar8));
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar9),auVar115);
        fVar156 = auVar178._0_4_;
        fVar129 = auVar178._4_4_;
        fVar130 = auVar178._8_4_;
        fVar131 = auVar178._12_4_;
        auVar53._28_4_ = auVar126._28_4_;
        auVar53._0_28_ =
             ZEXT1628(CONCAT412(fVar131 * auVar8._12_4_,
                                CONCAT48(fVar130 * auVar8._8_4_,
                                         CONCAT44(fVar129 * auVar8._4_4_,fVar156 * auVar8._0_4_))));
        auVar119._4_4_ = uVar102;
        auVar119._0_4_ = uVar102;
        auVar119._8_4_ = uVar102;
        auVar119._12_4_ = uVar102;
        auVar119._16_4_ = uVar102;
        auVar119._20_4_ = uVar102;
        auVar119._24_4_ = uVar102;
        auVar119._28_4_ = uVar102;
        uVar107 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar144._4_4_ = uVar107;
        auVar144._0_4_ = uVar107;
        auVar144._8_4_ = uVar107;
        auVar144._12_4_ = uVar107;
        auVar144._16_4_ = uVar107;
        auVar144._20_4_ = uVar107;
        auVar144._24_4_ = uVar107;
        auVar144._28_4_ = uVar107;
        auVar115 = vcmpps_avx(auVar119,auVar53,2);
        auVar126 = vcmpps_avx(auVar53,auVar144,2);
        auVar115 = vandps_avx(auVar126,auVar115);
        auVar178 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
        auVar180 = vpand_avx(auVar180,auVar178);
        auVar115 = vpmovsxwd_avx2(auVar180);
        if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar115 >> 0x7f,0) == '\0') &&
              (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar115 >> 0xbf,0) == '\0') &&
            (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar115[0x1f]) goto LAB_01435b7c;
        auVar115 = vcmpps_avx(ZEXT1632(auVar6),ZEXT832(0) << 0x20,4);
        auVar178 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
        auVar180 = vpand_avx(auVar180,auVar178);
        auVar115 = vpmovsxwd_avx2(auVar180);
        auVar189._8_8_ = uStack_578;
        auVar189._0_8_ = local_580;
        auVar189._16_8_ = uStack_570;
        auVar189._24_8_ = uStack_568;
        if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar115 >> 0x7f,0) != '\0') ||
              (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar115 >> 0xbf,0) != '\0') ||
            (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar115[0x1f] < '\0') {
          auVar120 = ZEXT1632(CONCAT412(fVar131 * auVar179._12_4_,
                                        CONCAT48(fVar130 * auVar179._8_4_,
                                                 CONCAT44(fVar129 * auVar179._4_4_,
                                                          fVar156 * auVar179._0_4_))));
          auVar145 = ZEXT1632(CONCAT412(fVar131 * auVar5._12_4_,
                                        CONCAT48(fVar130 * auVar5._8_4_,
                                                 CONCAT44(fVar129 * auVar5._4_4_,
                                                          fVar156 * auVar5._0_4_))));
          auVar188._8_4_ = 0x3f800000;
          auVar188._0_8_ = 0x3f8000003f800000;
          auVar188._12_4_ = 0x3f800000;
          auVar188._16_4_ = 0x3f800000;
          auVar188._20_4_ = 0x3f800000;
          auVar188._24_4_ = 0x3f800000;
          auVar188._28_4_ = 0x3f800000;
          auVar126 = vsubps_avx(auVar188,auVar120);
          _local_160 = vblendvps_avx(auVar126,auVar120,auVar123);
          auVar126 = vsubps_avx(auVar188,auVar145);
          local_3a0 = vblendvps_avx(auVar126,auVar145,auVar123);
          auVar189 = auVar115;
          local_560 = auVar53;
        }
      }
      auVar235 = ZEXT3264(local_740);
      auVar173 = ZEXT3264(auVar233);
      auVar225 = ZEXT3264(_local_6e0);
      auVar183 = ZEXT3264(auVar228);
      auVar154 = ZEXT3264(auVar218);
      auVar215 = ZEXT3264(local_6c0);
      if ((((((((auVar189 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar189 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar189 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar189 >> 0x7f,0) == '\0') &&
            (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar189 >> 0xbf,0) == '\0') &&
          (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar189[0x1f]) {
        auVar154 = ZEXT3264(local_700);
        auVar183 = ZEXT3264(local_5e0);
      }
      else {
        auVar115 = vsubps_avx(auVar187,auVar186);
        auVar180 = vfmadd213ps_fma(auVar115,_local_160,auVar186);
        fVar156 = *(float *)((long)local_710->ray_space + k * 4 + -0x10);
        auVar54._4_4_ = (auVar180._4_4_ + auVar180._4_4_) * fVar156;
        auVar54._0_4_ = (auVar180._0_4_ + auVar180._0_4_) * fVar156;
        auVar54._8_4_ = (auVar180._8_4_ + auVar180._8_4_) * fVar156;
        auVar54._12_4_ = (auVar180._12_4_ + auVar180._12_4_) * fVar156;
        auVar54._16_4_ = fVar156 * 0.0;
        auVar54._20_4_ = fVar156 * 0.0;
        auVar54._24_4_ = fVar156 * 0.0;
        auVar54._28_4_ = 0;
        auVar115 = vcmpps_avx(local_560,auVar54,6);
        auVar126 = auVar189 & auVar115;
        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar126 >> 0x7f,0) != '\0') ||
              (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar126 >> 0xbf,0) != '\0') ||
            (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar126[0x1f] < '\0') {
          auVar146._8_4_ = 0xbf800000;
          auVar146._0_8_ = 0xbf800000bf800000;
          auVar146._12_4_ = 0xbf800000;
          auVar146._16_4_ = 0xbf800000;
          auVar146._20_4_ = 0xbf800000;
          auVar146._24_4_ = 0xbf800000;
          auVar146._28_4_ = 0xbf800000;
          auVar170._8_4_ = 0x40000000;
          auVar170._0_8_ = 0x4000000040000000;
          auVar170._12_4_ = 0x40000000;
          auVar170._16_4_ = 0x40000000;
          auVar170._20_4_ = 0x40000000;
          auVar170._24_4_ = 0x40000000;
          auVar170._28_4_ = 0x40000000;
          auVar180 = vfmadd213ps_fma(local_3a0,auVar170,auVar146);
          local_2c0 = _local_160;
          local_3a0 = ZEXT1632(auVar180);
          auVar126 = local_3a0;
          local_2a0 = ZEXT1632(auVar180);
          local_280 = local_560;
          local_260 = 0;
          local_25c = iVar105;
          local_250 = local_810;
          uStack_248 = uStack_808;
          local_240 = local_830;
          uStack_238 = uStack_828;
          local_230 = local_7c0._0_8_;
          uStack_228 = local_7c0._8_8_;
          local_220 = local_820;
          uStack_218 = uStack_818;
          local_3a0 = auVar126;
          if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            local_5c0 = vandps_avx(auVar115,auVar189);
            fVar156 = 1.0 / (float)local_4c0._0_4_;
            local_1e0[0] = fVar156 * ((float)local_160._0_4_ + 0.0);
            local_1e0[1] = fVar156 * ((float)local_160._4_4_ + 1.0);
            local_1e0[2] = fVar156 * (fStack_158 + 2.0);
            local_1e0[3] = fVar156 * (fStack_154 + 3.0);
            fStack_1d0 = fVar156 * (fStack_150 + 4.0);
            fStack_1cc = fVar156 * (fStack_14c + 5.0);
            fStack_1c8 = fVar156 * (fStack_148 + 6.0);
            fStack_1c4 = fStack_144 + 7.0;
            local_3a0._0_8_ = auVar180._0_8_;
            local_3a0._8_8_ = auVar180._8_8_;
            local_1c0 = local_3a0._0_8_;
            uStack_1b8 = local_3a0._8_8_;
            uStack_1b0 = 0;
            uStack_1a8 = 0;
            local_1a0 = local_560;
            auVar147._8_4_ = 0x7f800000;
            auVar147._0_8_ = 0x7f8000007f800000;
            auVar147._12_4_ = 0x7f800000;
            auVar147._16_4_ = 0x7f800000;
            auVar147._20_4_ = 0x7f800000;
            auVar147._24_4_ = 0x7f800000;
            auVar147._28_4_ = 0x7f800000;
            auVar115 = vblendvps_avx(auVar147,local_560,local_5c0);
            auVar126 = vshufps_avx(auVar115,auVar115,0xb1);
            auVar126 = vminps_avx(auVar115,auVar126);
            auVar120 = vshufpd_avx(auVar126,auVar126,5);
            auVar126 = vminps_avx(auVar126,auVar120);
            auVar120 = vpermpd_avx2(auVar126,0x4e);
            auVar126 = vminps_avx(auVar126,auVar120);
            auVar126 = vcmpps_avx(auVar115,auVar126,0);
            auVar120 = local_5c0 & auVar126;
            auVar115 = local_5c0;
            if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar120 >> 0x7f,0) != '\0') ||
                  (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar120 >> 0xbf,0) != '\0') ||
                (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar120[0x1f] < '\0') {
              auVar115 = vandps_avx(auVar126,local_5c0);
            }
            uVar98 = vmovmskps_avx(auVar115);
            uVar102 = 0;
            for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
              uVar102 = uVar102 + 1;
            }
            uVar101 = (ulong)uVar102;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar156 = local_1e0[uVar101];
              uVar107 = *(undefined4 *)((long)&local_1c0 + uVar101 * 4);
              fVar130 = 1.0 - fVar156;
              fVar129 = fVar130 * fVar130 * -3.0;
              auVar180 = vfmadd231ss_fma(ZEXT416((uint)(fVar130 * fVar130)),
                                         ZEXT416((uint)(fVar156 * fVar130)),ZEXT416(0xc0000000));
              auVar178 = vfmsub132ss_fma(ZEXT416((uint)(fVar156 * fVar130)),
                                         ZEXT416((uint)(fVar156 * fVar156)),ZEXT416(0x40000000));
              fVar130 = auVar180._0_4_ * 3.0;
              fVar131 = auVar178._0_4_ * 3.0;
              fVar132 = fVar156 * fVar156 * 3.0;
              auVar190._0_4_ = fVar132 * fVar21;
              auVar190._4_4_ = fVar132 * fVar206;
              auVar190._8_4_ = fVar132 * fVar19;
              auVar190._12_4_ = fVar132 * fVar20;
              auVar160._4_4_ = fVar131;
              auVar160._0_4_ = fVar131;
              auVar160._8_4_ = fVar131;
              auVar160._12_4_ = fVar131;
              auVar180 = vfmadd132ps_fma(auVar160,auVar190,local_7c0);
              auVar176._4_4_ = fVar130;
              auVar176._0_4_ = fVar130;
              auVar176._8_4_ = fVar130;
              auVar176._12_4_ = fVar130;
              auVar180 = vfmadd132ps_fma(auVar176,auVar180,auVar158);
              auVar161._4_4_ = fVar129;
              auVar161._0_4_ = fVar129;
              auVar161._8_4_ = fVar129;
              auVar161._12_4_ = fVar129;
              auVar180 = vfmadd132ps_fma(auVar161,auVar180,auVar7);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a0 + uVar101 * 4);
              *(int *)(ray + k * 4 + 0xc0) = auVar180._0_4_;
              uVar13 = vextractps_avx(auVar180,1);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar13;
              uVar13 = vextractps_avx(auVar180,2);
              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar13;
              *(float *)(ray + k * 4 + 0xf0) = fVar156;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar107;
              *(uint *)(ray + k * 4 + 0x110) = uVar12;
              *(uint *)(ray + k * 4 + 0x120) = uVar99;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              local_7e0._0_16_ = CONCAT412(uVar99,CONCAT48(uVar99,CONCAT44(uVar99,uVar99)));
              local_7e0 = ZEXT1632(local_7e0._0_16_);
              local_600._0_8_ = CONCAT44(uVar12,uVar12);
              local_600 = ZEXT1632(CONCAT412(uVar12,CONCAT48(uVar12,local_600._0_8_)));
              local_540 = ZEXT1632(*local_718);
              local_860 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
              local_780 = auVar228;
              local_760 = auVar218;
              local_620 = auVar233;
              while( true ) {
                auVar115 = local_860;
                local_440 = local_1e0[uVar101];
                local_430 = *(undefined4 *)((long)&local_1c0 + uVar101 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a0 + uVar101 * 4);
                fVar130 = 1.0 - local_440;
                auVar178 = vfmadd231ss_fma(ZEXT416((uint)(fVar130 * fVar130)),
                                           ZEXT416((uint)(local_440 * fVar130)),ZEXT416(0xc0000000))
                ;
                auVar180 = vfmsub132ss_fma(ZEXT416((uint)(local_440 * fVar130)),
                                           ZEXT416((uint)(local_440 * local_440)),
                                           ZEXT416(0x40000000));
                fVar156 = auVar180._0_4_ * 3.0;
                fVar129 = local_440 * local_440 * 3.0;
                auVar193._0_4_ = fVar129 * fVar21;
                auVar193._4_4_ = fVar129 * fVar206;
                auVar193._8_4_ = fVar129 * fVar19;
                auVar193._12_4_ = fVar129 * fVar20;
                auVar166._4_4_ = fVar156;
                auVar166._0_4_ = fVar156;
                auVar166._8_4_ = fVar156;
                auVar166._12_4_ = fVar156;
                auVar180 = vfmadd132ps_fma(auVar166,auVar193,local_7c0);
                fVar156 = auVar178._0_4_ * 3.0;
                auVar185._4_4_ = fVar156;
                auVar185._0_4_ = fVar156;
                auVar185._8_4_ = fVar156;
                auVar185._12_4_ = fVar156;
                auVar180 = vfmadd132ps_fma(auVar185,auVar180,auVar158);
                fVar156 = fVar130 * fVar130 * -3.0;
                local_7b0.context = context->user;
                auVar167._4_4_ = fVar156;
                auVar167._0_4_ = fVar156;
                auVar167._8_4_ = fVar156;
                auVar167._12_4_ = fVar156;
                auVar178 = vfmadd132ps_fma(auVar167,auVar180,auVar7);
                local_470 = auVar178._0_4_;
                uStack_46c = local_470;
                uStack_468 = local_470;
                uStack_464 = local_470;
                auVar180 = vshufps_avx(auVar178,auVar178,0x55);
                local_460 = auVar180;
                local_450 = vshufps_avx(auVar178,auVar178,0xaa);
                fStack_43c = local_440;
                fStack_438 = local_440;
                fStack_434 = local_440;
                uStack_42c = local_430;
                uStack_428 = local_430;
                uStack_424 = local_430;
                local_420 = local_600._0_8_;
                uStack_418 = local_600._8_8_;
                local_410 = local_7e0._0_16_;
                vpcmpeqd_avx2(ZEXT1632(local_7e0._0_16_),ZEXT1632(local_7e0._0_16_));
                uStack_3fc = (local_7b0.context)->instID[0];
                local_400 = uStack_3fc;
                uStack_3f8 = uStack_3fc;
                uStack_3f4 = uStack_3fc;
                uStack_3f0 = (local_7b0.context)->instPrimID[0];
                uStack_3ec = uStack_3f0;
                uStack_3e8 = uStack_3f0;
                uStack_3e4 = uStack_3f0;
                local_800 = local_540._0_16_;
                local_7b0.valid = (int *)local_800;
                local_7b0.geometryUserPtr = pGVar14->userPtr;
                local_7b0.hit = (RTCHitN *)&local_470;
                local_7b0.N = 4;
                local_7b0.ray = (RTCRayN *)ray;
                if (pGVar14->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar14->intersectionFilterN)(&local_7b0);
                  auVar225 = ZEXT3264(_local_6e0);
                  auVar154 = ZEXT3264(local_760);
                  auVar183 = ZEXT3264(local_780);
                  auVar173 = ZEXT3264(local_620);
                  auVar215 = ZEXT3264(local_6c0);
                  auVar235 = ZEXT3264(local_740);
                }
                if (local_800 == (undefined1  [16])0x0) {
                  auVar180 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar178 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
                  auVar180 = auVar180 ^ auVar178;
                }
                else {
                  p_Var17 = context->args->filter;
                  auVar178 = vpcmpeqd_avx(auVar180,auVar180);
                  if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar14->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var17)(&local_7b0);
                    auVar225 = ZEXT3264(_local_6e0);
                    auVar154 = ZEXT3264(local_760);
                    auVar183 = ZEXT3264(local_780);
                    auVar173 = ZEXT3264(local_620);
                    auVar215 = ZEXT3264(local_6c0);
                    auVar235 = ZEXT3264(local_740);
                    auVar178 = vpcmpeqd_avx(auVar178,auVar178);
                  }
                  auVar179 = vpcmpeqd_avx(local_800,_DAT_01f45a50);
                  auVar180 = auVar179 ^ auVar178;
                  if (local_800 != (undefined1  [16])0x0) {
                    auVar179 = auVar179 ^ auVar178;
                    auVar178 = vmaskmovps_avx(auVar179,*(undefined1 (*) [16])local_7b0.hit);
                    *(undefined1 (*) [16])(local_7b0.ray + 0xc0) = auVar178;
                    auVar178 = vmaskmovps_avx(auVar179,*(undefined1 (*) [16])(local_7b0.hit + 0x10))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0xd0) = auVar178;
                    auVar178 = vmaskmovps_avx(auVar179,*(undefined1 (*) [16])(local_7b0.hit + 0x20))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0xe0) = auVar178;
                    auVar178 = vmaskmovps_avx(auVar179,*(undefined1 (*) [16])(local_7b0.hit + 0x30))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0xf0) = auVar178;
                    auVar178 = vmaskmovps_avx(auVar179,*(undefined1 (*) [16])(local_7b0.hit + 0x40))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0x100) = auVar178;
                    auVar178 = vmaskmovps_avx(auVar179,*(undefined1 (*) [16])(local_7b0.hit + 0x50))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0x110) = auVar178;
                    auVar178 = vmaskmovps_avx(auVar179,*(undefined1 (*) [16])(local_7b0.hit + 0x60))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0x120) = auVar178;
                    auVar178 = vmaskmovps_avx(auVar179,*(undefined1 (*) [16])(local_7b0.hit + 0x70))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0x130) = auVar178;
                    auVar178 = vmaskmovps_avx(auVar179,*(undefined1 (*) [16])(local_7b0.hit + 0x80))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0x140) = auVar178;
                  }
                }
                auVar126 = local_560;
                auVar228 = auVar183._0_32_;
                auVar233 = auVar173._0_32_;
                auVar218 = auVar154._0_32_;
                auVar138._8_8_ = 0x100000001;
                auVar138._0_8_ = 0x100000001;
                if ((auVar138 & auVar180) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_860._0_4_;
                }
                else {
                  local_860._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_860._4_4_ = 0;
                  local_860._8_4_ = 0;
                  local_860._12_4_ = 0;
                }
                *(undefined4 *)(local_5c0 + uVar101 * 4) = 0;
                local_860._16_16_ = auVar115._16_16_;
                auVar127._4_4_ = local_860._0_4_;
                auVar127._0_4_ = local_860._0_4_;
                auVar127._8_4_ = local_860._0_4_;
                auVar127._12_4_ = local_860._0_4_;
                auVar127._16_4_ = local_860._0_4_;
                auVar127._20_4_ = local_860._0_4_;
                auVar127._24_4_ = local_860._0_4_;
                auVar127._28_4_ = local_860._0_4_;
                auVar120 = vcmpps_avx(auVar126,auVar127,2);
                auVar115 = vandps_avx(auVar120,local_5c0);
                local_5c0 = local_5c0 & auVar120;
                if ((((((((local_5c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_5c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_5c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_5c0 >> 0x7f,0) == '\0') &&
                      (local_5c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_5c0 >> 0xbf,0) == '\0') &&
                    (local_5c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_5c0[0x1f]) break;
                auVar153._8_4_ = 0x7f800000;
                auVar153._0_8_ = 0x7f8000007f800000;
                auVar153._12_4_ = 0x7f800000;
                auVar153._16_4_ = 0x7f800000;
                auVar153._20_4_ = 0x7f800000;
                auVar153._24_4_ = 0x7f800000;
                auVar153._28_4_ = 0x7f800000;
                auVar126 = vblendvps_avx(auVar153,auVar126,auVar115);
                auVar120 = vshufps_avx(auVar126,auVar126,0xb1);
                auVar120 = vminps_avx(auVar126,auVar120);
                auVar145 = vshufpd_avx(auVar120,auVar120,5);
                auVar120 = vminps_avx(auVar120,auVar145);
                auVar145 = vpermpd_avx2(auVar120,0x4e);
                auVar120 = vminps_avx(auVar120,auVar145);
                auVar120 = vcmpps_avx(auVar126,auVar120,0);
                auVar145 = auVar115 & auVar120;
                auVar126 = auVar115;
                if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar145 >> 0x7f,0) != '\0') ||
                      (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar145 >> 0xbf,0) != '\0') ||
                    (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar145[0x1f] < '\0') {
                  auVar126 = vandps_avx(auVar120,auVar115);
                }
                uVar99 = vmovmskps_avx(auVar126);
                uVar102 = 0;
                for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x80000000) {
                  uVar102 = uVar102 + 1;
                }
                uVar101 = (ulong)uVar102;
                local_5c0 = auVar115;
              }
            }
          }
        }
        auVar154 = ZEXT3264(local_700);
        auVar183 = ZEXT3264(local_5e0);
      }
    }
    auVar173 = ZEXT3264(CONCAT428(fStack_624,
                                  CONCAT424(fStack_628,
                                            CONCAT420(fStack_62c,
                                                      CONCAT416(fStack_630,
                                                                CONCAT412(fStack_634,
                                                                          CONCAT48(fStack_638,
                                                                                   CONCAT44(
                                                  fStack_63c,local_640))))))));
    if (8 < iVar105) {
      local_380._4_4_ = iVar105;
      local_380._0_4_ = iVar105;
      local_380._8_4_ = iVar105;
      local_380._12_4_ = iVar105;
      local_380._16_4_ = iVar105;
      local_380._20_4_ = iVar105;
      local_380._24_4_ = iVar105;
      local_380._28_4_ = iVar105;
      local_100 = fVar157;
      fStack_fc = fVar157;
      fStack_f8 = fVar157;
      fStack_f4 = fVar157;
      fStack_f0 = fVar157;
      fStack_ec = fVar157;
      fStack_e8 = fVar157;
      fStack_e4 = fVar157;
      local_120 = local_680._0_4_;
      uStack_11c = local_680._0_4_;
      uStack_118 = local_680._0_4_;
      uStack_114 = local_680._0_4_;
      uStack_110 = local_680._0_4_;
      uStack_10c = local_680._0_4_;
      uStack_108 = local_680._0_4_;
      uStack_104 = local_680._0_4_;
      local_140 = 1.0 / (float)local_4c0._0_4_;
      fStack_13c = local_140;
      fStack_138 = local_140;
      fStack_134 = local_140;
      fStack_130 = local_140;
      fStack_12c = local_140;
      fStack_128 = local_140;
      fStack_124 = local_140;
      local_2d0 = local_4e0._0_4_;
      uStack_2cc = local_4e0._0_4_;
      uStack_2c8 = local_4e0._0_4_;
      uStack_2c4 = local_4e0._0_4_;
      local_690._4_4_ = local_690._0_4_;
      local_690._8_4_ = local_690._0_4_;
      local_690._12_4_ = local_690._0_4_;
      auVar128 = ZEXT1664(local_690);
      _local_6e0 = auVar225._0_32_;
      local_780 = auVar228;
      local_760 = auVar218;
      local_620 = auVar233;
      for (lVar104 = 8; local_700 = auVar154._0_32_, lVar104 < lVar106; lVar104 = lVar104 + 8) {
        auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar104 * 4 + lVar108);
        auVar126 = *(undefined1 (*) [32])(lVar108 + 0x21fb768 + lVar104 * 4);
        local_340 = *(undefined1 (*) [32])(lVar108 + 0x21fbbec + lVar104 * 4);
        pauVar2 = (undefined1 (*) [32])(lVar108 + 0x21fc070 + lVar104 * 4);
        fVar134 = *(float *)*pauVar2;
        fVar84 = *(float *)(*pauVar2 + 4);
        fVar85 = *(float *)(*pauVar2 + 8);
        fVar135 = *(float *)(*pauVar2 + 0xc);
        fVar155 = *(float *)(*pauVar2 + 0x10);
        fVar86 = *(float *)(*pauVar2 + 0x14);
        fVar87 = *(float *)(*pauVar2 + 0x18);
        auVar97 = *(undefined1 (*) [28])*pauVar2;
        auVar226._0_4_ = fVar134 * local_660;
        auVar226._4_4_ = fVar84 * fStack_65c;
        auVar226._8_4_ = fVar85 * fStack_658;
        auVar226._12_4_ = fVar135 * fStack_654;
        auVar226._16_4_ = fVar155 * fStack_650;
        auVar226._20_4_ = fVar86 * fStack_64c;
        auVar226._28_36_ = auVar225._28_36_;
        auVar226._24_4_ = fVar87 * fStack_648;
        auVar225._0_4_ = fVar134 * auVar173._0_4_;
        auVar225._4_4_ = fVar84 * auVar173._4_4_;
        auVar225._8_4_ = fVar85 * auVar173._8_4_;
        auVar225._12_4_ = fVar135 * auVar173._12_4_;
        auVar225._16_4_ = fVar155 * auVar173._16_4_;
        auVar225._20_4_ = fVar86 * auVar173._20_4_;
        auVar225._28_36_ = auVar128._28_36_;
        auVar225._24_4_ = fVar87 * auVar173._24_4_;
        auVar180 = vfmadd231ps_fma(auVar226._0_32_,local_340,auVar183._0_32_);
        auVar234 = auVar235._0_32_;
        auVar178 = vfmadd231ps_fma(auVar225._0_32_,local_340,auVar234);
        auVar123 = auVar215._0_32_;
        auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar126,auVar123);
        auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),auVar126,local_520);
        auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar115,auVar230);
        auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),auVar115,local_4a0);
        auVar120 = *(undefined1 (*) [32])(bezier_basis1 + lVar104 * 4 + lVar108);
        auVar145 = *(undefined1 (*) [32])(lVar108 + 0x21fdb88 + lVar104 * 4);
        auVar124 = *(undefined1 (*) [32])(lVar108 + 0x21fe00c + lVar104 * 4);
        pfVar1 = (float *)(lVar108 + 0x21fe490 + lVar104 * 4);
        fVar88 = *pfVar1;
        fVar89 = pfVar1[1];
        fVar90 = pfVar1[2];
        fVar91 = pfVar1[3];
        fVar92 = pfVar1[4];
        fVar93 = pfVar1[5];
        fVar94 = pfVar1[6];
        auVar154._0_4_ = fVar88 * local_660;
        auVar154._4_4_ = fVar89 * fStack_65c;
        auVar154._8_4_ = fVar90 * fStack_658;
        auVar154._12_4_ = fVar91 * fStack_654;
        auVar154._16_4_ = fVar92 * fStack_650;
        auVar154._20_4_ = fVar93 * fStack_64c;
        auVar154._28_36_ = auVar173._28_36_;
        auVar154._24_4_ = fVar94 * fStack_648;
        auVar55._4_4_ = auVar173._4_4_ * fVar89;
        auVar55._0_4_ = auVar173._0_4_ * fVar88;
        auVar55._8_4_ = auVar173._8_4_ * fVar90;
        auVar55._12_4_ = auVar173._12_4_ * fVar91;
        auVar55._16_4_ = auVar173._16_4_ * fVar92;
        auVar55._20_4_ = auVar173._20_4_ * fVar93;
        auVar55._24_4_ = auVar173._24_4_ * fVar94;
        auVar55._28_4_ = fStack_644;
        auVar179 = vfmadd231ps_fma(auVar154._0_32_,auVar124,auVar183._0_32_);
        auVar5 = vfmadd231ps_fma(auVar55,auVar124,auVar234);
        auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar145,auVar123);
        auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar145,local_520);
        auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar120,auVar230);
        auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar120,local_4a0);
        local_600 = ZEXT1632(auVar179);
        local_540 = ZEXT1632(auVar180);
        local_4c0 = vsubps_avx(local_600,local_540);
        local_680 = ZEXT1632(auVar5);
        local_300 = ZEXT1632(auVar178);
        local_320 = vsubps_avx(local_680,local_300);
        auVar122._0_4_ = auVar178._0_4_ * local_4c0._0_4_;
        auVar122._4_4_ = auVar178._4_4_ * local_4c0._4_4_;
        auVar122._8_4_ = auVar178._8_4_ * local_4c0._8_4_;
        auVar122._12_4_ = auVar178._12_4_ * local_4c0._12_4_;
        auVar122._16_4_ = local_4c0._16_4_ * 0.0;
        auVar122._20_4_ = local_4c0._20_4_ * 0.0;
        auVar122._24_4_ = local_4c0._24_4_ * 0.0;
        auVar122._28_4_ = 0;
        fVar157 = local_320._0_4_;
        auVar148._0_4_ = auVar180._0_4_ * fVar157;
        fVar156 = local_320._4_4_;
        auVar148._4_4_ = auVar180._4_4_ * fVar156;
        fVar129 = local_320._8_4_;
        auVar148._8_4_ = auVar180._8_4_ * fVar129;
        fVar130 = local_320._12_4_;
        auVar148._12_4_ = auVar180._12_4_ * fVar130;
        fVar131 = local_320._16_4_;
        auVar148._16_4_ = fVar131 * 0.0;
        fVar132 = local_320._20_4_;
        auVar148._20_4_ = fVar132 * 0.0;
        fVar133 = local_320._24_4_;
        auVar148._24_4_ = fVar133 * 0.0;
        auVar148._28_4_ = 0;
        auVar209 = vsubps_avx(auVar122,auVar148);
        _local_360 = *pauVar2;
        auVar139 = _local_360;
        auVar222._0_4_ = fVar134 * (float)local_e0;
        auVar222._4_4_ = fVar84 * local_e0._4_4_;
        auVar222._8_4_ = fVar85 * (float)uStack_d8;
        auVar222._12_4_ = fVar135 * uStack_d8._4_4_;
        auVar222._16_4_ = fVar155 * (float)uStack_d0;
        auVar222._20_4_ = fVar86 * uStack_d0._4_4_;
        auVar222._24_4_ = fVar87 * (float)uStack_c8;
        auVar222._28_4_ = 0;
        auVar180 = vfmadd231ps_fma(auVar222,local_340,local_620);
        auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),local_c0,auVar126);
        auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),local_a0,auVar115);
        auVar225 = ZEXT1664(auVar180);
        auVar56._4_4_ = fVar89 * local_e0._4_4_;
        auVar56._0_4_ = fVar88 * (float)local_e0;
        auVar56._8_4_ = fVar90 * (float)uStack_d8;
        auVar56._12_4_ = fVar91 * uStack_d8._4_4_;
        auVar56._16_4_ = fVar92 * (float)uStack_d0;
        auVar56._20_4_ = fVar93 * uStack_d0._4_4_;
        auVar56._24_4_ = fVar94 * (float)uStack_c8;
        auVar56._28_4_ = uStack_c8._4_4_;
        auVar178 = vfmadd231ps_fma(auVar56,auVar124,local_620);
        auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),auVar145,local_c0);
        auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),auVar120,local_a0);
        auVar183._0_4_ = fVar157 * fVar157;
        auVar183._4_4_ = fVar156 * fVar156;
        auVar183._8_4_ = fVar129 * fVar129;
        auVar183._12_4_ = fVar130 * fVar130;
        auVar183._16_4_ = fVar131 * fVar131;
        auVar183._20_4_ = fVar132 * fVar132;
        auVar183._28_36_ = auVar215._28_36_;
        auVar183._24_4_ = fVar133 * fVar133;
        auVar179 = vfmadd231ps_fma(auVar183._0_32_,local_4c0,local_4c0);
        auVar113 = ZEXT1632(auVar180);
        auVar18 = vmaxps_avx(auVar113,ZEXT1632(auVar178));
        auVar213._0_4_ = auVar18._0_4_ * auVar18._0_4_ * auVar179._0_4_;
        auVar213._4_4_ = auVar18._4_4_ * auVar18._4_4_ * auVar179._4_4_;
        auVar213._8_4_ = auVar18._8_4_ * auVar18._8_4_ * auVar179._8_4_;
        auVar213._12_4_ = auVar18._12_4_ * auVar18._12_4_ * auVar179._12_4_;
        auVar213._16_4_ = auVar18._16_4_ * auVar18._16_4_ * 0.0;
        auVar213._20_4_ = auVar18._20_4_ * auVar18._20_4_ * 0.0;
        auVar213._24_4_ = auVar18._24_4_ * auVar18._24_4_ * 0.0;
        auVar213._28_4_ = 0;
        auVar57._4_4_ = auVar209._4_4_ * auVar209._4_4_;
        auVar57._0_4_ = auVar209._0_4_ * auVar209._0_4_;
        auVar57._8_4_ = auVar209._8_4_ * auVar209._8_4_;
        auVar57._12_4_ = auVar209._12_4_ * auVar209._12_4_;
        auVar57._16_4_ = auVar209._16_4_ * auVar209._16_4_;
        auVar57._20_4_ = auVar209._20_4_ * auVar209._20_4_;
        auVar57._24_4_ = auVar209._24_4_ * auVar209._24_4_;
        auVar57._28_4_ = auVar209._28_4_;
        auVar18 = vcmpps_avx(auVar57,auVar213,2);
        local_260 = (int)lVar104;
        auVar214._4_4_ = local_260;
        auVar214._0_4_ = local_260;
        auVar214._8_4_ = local_260;
        auVar214._12_4_ = local_260;
        auVar214._16_4_ = local_260;
        auVar214._20_4_ = local_260;
        auVar214._24_4_ = local_260;
        auVar214._28_4_ = local_260;
        auVar209 = vpor_avx2(auVar214,_DAT_01fb4ba0);
        auVar128 = ZEXT3264(local_380);
        auVar112 = vpcmpgtd_avx2(local_380,auVar209);
        auVar209 = auVar112 & auVar18;
        if ((((((((auVar209 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar209 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar209 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar209 >> 0x7f,0) == '\0') &&
              (auVar209 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar209 >> 0xbf,0) == '\0') &&
            (auVar209 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar209[0x1f]) {
          auVar154 = ZEXT3264(local_700);
          auVar235 = ZEXT3264(auVar234);
          auVar173 = ZEXT3264(CONCAT428(fStack_624,
                                        CONCAT424(fStack_628,
                                                  CONCAT420(fStack_62c,
                                                            CONCAT416(fStack_630,
                                                                      CONCAT412(fStack_634,
                                                                                CONCAT48(fStack_638,
                                                                                         CONCAT44(
                                                  fStack_63c,local_640))))))));
          auVar215 = ZEXT3264(auVar123);
        }
        else {
          local_4e0 = vandps_avx(auVar112,auVar18);
          auVar58._4_4_ = (float)local_6e0._4_4_ * fVar89;
          auVar58._0_4_ = (float)local_6e0._0_4_ * fVar88;
          auVar58._8_4_ = fStack_6d8 * fVar90;
          auVar58._12_4_ = fStack_6d4 * fVar91;
          auVar58._16_4_ = fStack_6d0 * fVar92;
          auVar58._20_4_ = fStack_6cc * fVar93;
          auVar58._24_4_ = fStack_6c8 * fVar94;
          auVar58._28_4_ = auVar18._28_4_;
          auVar179 = vfmadd213ps_fma(auVar124,local_760,auVar58);
          auVar179 = vfmadd213ps_fma(auVar145,local_500,ZEXT1632(auVar179));
          auVar179 = vfmadd213ps_fma(auVar120,local_780,ZEXT1632(auVar179));
          local_360._0_4_ = auVar97._0_4_;
          local_360._4_4_ = auVar97._4_4_;
          fStack_358 = auVar97._8_4_;
          fStack_354 = auVar97._12_4_;
          fStack_350 = auVar97._16_4_;
          fStack_34c = auVar97._20_4_;
          fStack_348 = auVar97._24_4_;
          auVar59._4_4_ = (float)local_6e0._4_4_ * (float)local_360._4_4_;
          auVar59._0_4_ = (float)local_6e0._0_4_ * (float)local_360._0_4_;
          auVar59._8_4_ = fStack_6d8 * fStack_358;
          auVar59._12_4_ = fStack_6d4 * fStack_354;
          auVar59._16_4_ = fStack_6d0 * fStack_350;
          auVar59._20_4_ = fStack_6cc * fStack_34c;
          auVar59._24_4_ = fStack_6c8 * fStack_348;
          auVar59._28_4_ = auVar18._28_4_;
          auVar5 = vfmadd213ps_fma(local_340,local_760,auVar59);
          auVar5 = vfmadd213ps_fma(auVar126,local_500,ZEXT1632(auVar5));
          auVar126 = *(undefined1 (*) [32])(lVar108 + 0x21fc4f4 + lVar104 * 4);
          auVar120 = *(undefined1 (*) [32])(lVar108 + 0x21fc978 + lVar104 * 4);
          auVar145 = *(undefined1 (*) [32])(lVar108 + 0x21fcdfc + lVar104 * 4);
          pfVar1 = (float *)(lVar108 + 0x21fd280 + lVar104 * 4);
          fVar157 = *pfVar1;
          fVar156 = pfVar1[1];
          fVar129 = pfVar1[2];
          fVar130 = pfVar1[3];
          fVar131 = pfVar1[4];
          fVar132 = pfVar1[5];
          fVar133 = pfVar1[6];
          auVar60._4_4_ = fVar156 * fStack_65c;
          auVar60._0_4_ = fVar157 * local_660;
          auVar60._8_4_ = fVar129 * fStack_658;
          auVar60._12_4_ = fVar130 * fStack_654;
          auVar60._16_4_ = fVar131 * fStack_650;
          auVar60._20_4_ = fVar132 * fStack_64c;
          auVar60._24_4_ = fVar133 * fStack_648;
          auVar60._28_4_ = local_500._28_4_;
          auVar223._0_4_ = local_640 * fVar157;
          auVar223._4_4_ = fStack_63c * fVar156;
          auVar223._8_4_ = fStack_638 * fVar129;
          auVar223._12_4_ = fStack_634 * fVar130;
          auVar223._16_4_ = fStack_630 * fVar131;
          auVar223._20_4_ = fStack_62c * fVar132;
          auVar223._24_4_ = fStack_628 * fVar133;
          auVar223._28_4_ = 0;
          auVar61._4_4_ = (float)local_6e0._4_4_ * fVar156;
          auVar61._0_4_ = (float)local_6e0._0_4_ * fVar157;
          auVar61._8_4_ = fStack_6d8 * fVar129;
          auVar61._12_4_ = fStack_6d4 * fVar130;
          auVar61._16_4_ = fStack_6d0 * fVar131;
          auVar61._20_4_ = fStack_6cc * fVar132;
          auVar61._24_4_ = fStack_6c8 * fVar133;
          auVar61._28_4_ = pfVar1[7];
          auVar6 = vfmadd231ps_fma(auVar60,auVar145,local_5e0);
          auVar8 = vfmadd231ps_fma(auVar223,auVar145,auVar234);
          auVar9 = vfmadd231ps_fma(auVar61,local_760,auVar145);
          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar120,auVar123);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar120,local_520);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),local_500,auVar120);
          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar126,auVar230);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar126,local_4a0);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),local_780,auVar126);
          pfVar1 = (float *)(lVar108 + 0x21ff6a0 + lVar104 * 4);
          fVar157 = *pfVar1;
          fVar156 = pfVar1[1];
          fVar129 = pfVar1[2];
          fVar130 = pfVar1[3];
          fVar131 = pfVar1[4];
          fVar132 = pfVar1[5];
          fVar133 = pfVar1[6];
          auVar62._4_4_ = fStack_65c * fVar156;
          auVar62._0_4_ = local_660 * fVar157;
          auVar62._8_4_ = fStack_658 * fVar129;
          auVar62._12_4_ = fStack_654 * fVar130;
          auVar62._16_4_ = fStack_650 * fVar131;
          auVar62._20_4_ = fStack_64c * fVar132;
          auVar62._24_4_ = fStack_648 * fVar133;
          auVar62._28_4_ = uStack_6c4;
          auVar63._4_4_ = fStack_63c * fVar156;
          auVar63._0_4_ = local_640 * fVar157;
          auVar63._8_4_ = fStack_638 * fVar129;
          auVar63._12_4_ = fStack_634 * fVar130;
          auVar63._16_4_ = fStack_630 * fVar131;
          auVar63._20_4_ = fStack_62c * fVar132;
          auVar63._24_4_ = fStack_628 * fVar133;
          auVar63._28_4_ = fStack_624;
          auVar64._4_4_ = fVar156 * (float)local_6e0._4_4_;
          auVar64._0_4_ = fVar157 * (float)local_6e0._0_4_;
          auVar64._8_4_ = fVar129 * fStack_6d8;
          auVar64._12_4_ = fVar130 * fStack_6d4;
          auVar64._16_4_ = fVar131 * fStack_6d0;
          auVar64._20_4_ = fVar132 * fStack_6cc;
          auVar64._24_4_ = fVar133 * fStack_6c8;
          auVar64._28_4_ = pfVar1[7];
          auVar126 = *(undefined1 (*) [32])(lVar108 + 0x21ff21c + lVar104 * 4);
          auVar10 = vfmadd231ps_fma(auVar62,auVar126,local_5e0);
          auVar197 = vfmadd231ps_fma(auVar63,auVar126,auVar234);
          auVar231 = vfmadd231ps_fma(auVar64,auVar126,local_760);
          auVar126 = *(undefined1 (*) [32])(lVar108 + 0x21fed98 + lVar104 * 4);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar126,auVar123);
          auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar126,local_520);
          auVar231 = vfmadd231ps_fma(ZEXT1632(auVar231),auVar126,local_500);
          auVar126 = *(undefined1 (*) [32])(lVar108 + 0x21fe914 + lVar104 * 4);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar126,auVar230);
          auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar126,local_4a0);
          auVar231 = vfmadd231ps_fma(ZEXT1632(auVar231),local_780,auVar126);
          auVar126 = vandps_avx(ZEXT1632(auVar6),local_180);
          auVar120 = vandps_avx(ZEXT1632(auVar8),local_180);
          auVar120 = vmaxps_avx(auVar126,auVar120);
          auVar126 = vandps_avx(ZEXT1632(auVar9),local_180);
          auVar126 = vmaxps_avx(auVar120,auVar126);
          auVar96._4_4_ = fStack_fc;
          auVar96._0_4_ = local_100;
          auVar96._8_4_ = fStack_f8;
          auVar96._12_4_ = fStack_f4;
          auVar96._16_4_ = fStack_f0;
          auVar96._20_4_ = fStack_ec;
          auVar96._24_4_ = fStack_e8;
          auVar96._28_4_ = fStack_e4;
          auVar126 = vcmpps_avx(auVar126,auVar96,1);
          auVar145 = vblendvps_avx(ZEXT1632(auVar6),local_4c0,auVar126);
          auVar124 = vblendvps_avx(ZEXT1632(auVar8),local_320,auVar126);
          auVar126 = vandps_avx(ZEXT1632(auVar10),local_180);
          auVar120 = vandps_avx(ZEXT1632(auVar197),local_180);
          auVar120 = vmaxps_avx(auVar126,auVar120);
          auVar126 = vandps_avx(local_180,ZEXT1632(auVar231));
          auVar126 = vmaxps_avx(auVar120,auVar126);
          auVar120 = vcmpps_avx(auVar126,auVar96,1);
          auVar126 = vblendvps_avx(ZEXT1632(auVar10),local_4c0,auVar120);
          auVar120 = vblendvps_avx(ZEXT1632(auVar197),local_320,auVar120);
          auVar5 = vfmadd213ps_fma(auVar115,local_780,ZEXT1632(auVar5));
          auVar6 = vfmadd213ps_fma(auVar145,auVar145,ZEXT832(0) << 0x20);
          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar124,auVar124);
          auVar115 = vrsqrtps_avx(ZEXT1632(auVar6));
          fVar157 = auVar115._0_4_;
          fVar156 = auVar115._4_4_;
          fVar129 = auVar115._8_4_;
          fVar130 = auVar115._12_4_;
          fVar131 = auVar115._16_4_;
          fVar132 = auVar115._20_4_;
          fVar133 = auVar115._24_4_;
          auVar65._4_4_ = fVar156 * fVar156 * fVar156 * auVar6._4_4_ * -0.5;
          auVar65._0_4_ = fVar157 * fVar157 * fVar157 * auVar6._0_4_ * -0.5;
          auVar65._8_4_ = fVar129 * fVar129 * fVar129 * auVar6._8_4_ * -0.5;
          auVar65._12_4_ = fVar130 * fVar130 * fVar130 * auVar6._12_4_ * -0.5;
          auVar65._16_4_ = fVar131 * fVar131 * fVar131 * -0.0;
          auVar65._20_4_ = fVar132 * fVar132 * fVar132 * -0.0;
          auVar65._24_4_ = fVar133 * fVar133 * fVar133 * -0.0;
          auVar65._28_4_ = 0;
          auVar171._8_4_ = 0x3fc00000;
          auVar171._0_8_ = 0x3fc000003fc00000;
          auVar171._12_4_ = 0x3fc00000;
          auVar171._16_4_ = 0x3fc00000;
          auVar171._20_4_ = 0x3fc00000;
          auVar171._24_4_ = 0x3fc00000;
          auVar171._28_4_ = 0x3fc00000;
          auVar6 = vfmadd231ps_fma(auVar65,auVar171,auVar115);
          fVar157 = auVar6._0_4_;
          fVar156 = auVar6._4_4_;
          auVar66._4_4_ = auVar124._4_4_ * fVar156;
          auVar66._0_4_ = auVar124._0_4_ * fVar157;
          fVar129 = auVar6._8_4_;
          auVar66._8_4_ = auVar124._8_4_ * fVar129;
          fVar130 = auVar6._12_4_;
          auVar66._12_4_ = auVar124._12_4_ * fVar130;
          auVar66._16_4_ = auVar124._16_4_ * 0.0;
          auVar66._20_4_ = auVar124._20_4_ * 0.0;
          auVar66._24_4_ = auVar124._24_4_ * 0.0;
          auVar66._28_4_ = auVar124._28_4_;
          auVar67._4_4_ = fVar156 * -auVar145._4_4_;
          auVar67._0_4_ = fVar157 * -auVar145._0_4_;
          auVar67._8_4_ = fVar129 * -auVar145._8_4_;
          auVar67._12_4_ = fVar130 * -auVar145._12_4_;
          auVar67._16_4_ = -auVar145._16_4_ * 0.0;
          auVar67._20_4_ = -auVar145._20_4_ * 0.0;
          auVar67._24_4_ = -auVar145._24_4_ * 0.0;
          auVar67._28_4_ = auVar115._28_4_;
          auVar6 = vfmadd213ps_fma(auVar126,auVar126,ZEXT832(0) << 0x20);
          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar120,auVar120);
          auVar115 = vrsqrtps_avx(ZEXT1632(auVar6));
          auVar68._28_4_ = local_4c0._28_4_;
          auVar68._0_28_ =
               ZEXT1628(CONCAT412(fVar130 * 0.0,
                                  CONCAT48(fVar129 * 0.0,CONCAT44(fVar156 * 0.0,fVar157 * 0.0))));
          fVar157 = auVar115._0_4_;
          fVar156 = auVar115._4_4_;
          fVar129 = auVar115._8_4_;
          fVar130 = auVar115._12_4_;
          fVar131 = auVar115._16_4_;
          fVar132 = auVar115._20_4_;
          fVar133 = auVar115._24_4_;
          auVar69._4_4_ = fVar156 * fVar156 * fVar156 * auVar6._4_4_ * -0.5;
          auVar69._0_4_ = fVar157 * fVar157 * fVar157 * auVar6._0_4_ * -0.5;
          auVar69._8_4_ = fVar129 * fVar129 * fVar129 * auVar6._8_4_ * -0.5;
          auVar69._12_4_ = fVar130 * fVar130 * fVar130 * auVar6._12_4_ * -0.5;
          auVar69._16_4_ = fVar131 * fVar131 * fVar131 * -0.0;
          auVar69._20_4_ = fVar132 * fVar132 * fVar132 * -0.0;
          auVar69._24_4_ = fVar133 * fVar133 * fVar133 * -0.0;
          auVar69._28_4_ = 0;
          auVar6 = vfmadd231ps_fma(auVar69,auVar171,auVar115);
          fVar157 = auVar6._0_4_;
          fVar156 = auVar6._4_4_;
          auVar70._4_4_ = auVar120._4_4_ * fVar156;
          auVar70._0_4_ = auVar120._0_4_ * fVar157;
          fVar129 = auVar6._8_4_;
          auVar70._8_4_ = auVar120._8_4_ * fVar129;
          fVar130 = auVar6._12_4_;
          auVar70._12_4_ = auVar120._12_4_ * fVar130;
          auVar70._16_4_ = auVar120._16_4_ * 0.0;
          auVar70._20_4_ = auVar120._20_4_ * 0.0;
          auVar70._24_4_ = auVar120._24_4_ * 0.0;
          auVar70._28_4_ = 0;
          auVar71._4_4_ = fVar156 * -auVar126._4_4_;
          auVar71._0_4_ = fVar157 * -auVar126._0_4_;
          auVar71._8_4_ = fVar129 * -auVar126._8_4_;
          auVar71._12_4_ = fVar130 * -auVar126._12_4_;
          auVar71._16_4_ = -auVar126._16_4_ * 0.0;
          auVar71._20_4_ = -auVar126._20_4_ * 0.0;
          auVar71._24_4_ = -auVar126._24_4_ * 0.0;
          auVar71._28_4_ = 0;
          auVar72._28_4_ = 0xbf000000;
          auVar72._0_28_ =
               ZEXT1628(CONCAT412(fVar130 * 0.0,
                                  CONCAT48(fVar129 * 0.0,CONCAT44(fVar156 * 0.0,fVar157 * 0.0))));
          auVar6 = vfmadd213ps_fma(auVar66,auVar113,local_540);
          auVar8 = vfmadd213ps_fma(auVar67,auVar113,local_300);
          auVar9 = vfmadd213ps_fma(auVar68,auVar113,ZEXT1632(auVar5));
          auVar231 = vfnmadd213ps_fma(auVar66,auVar113,local_540);
          auVar10 = vfmadd213ps_fma(auVar70,ZEXT1632(auVar178),local_600);
          auVar110 = vfnmadd213ps_fma(auVar67,auVar113,local_300);
          auVar115 = ZEXT1632(auVar178);
          auVar197 = vfmadd213ps_fma(auVar71,auVar115,local_680);
          auVar159 = vfnmadd231ps_fma(ZEXT1632(auVar5),auVar113,auVar68);
          auVar5 = vfmadd213ps_fma(auVar72,auVar115,ZEXT1632(auVar179));
          auVar111 = vfnmadd213ps_fma(auVar70,auVar115,local_600);
          auVar136 = vfnmadd213ps_fma(auVar71,auVar115,local_680);
          local_680 = ZEXT1632(auVar178);
          auVar174 = vfnmadd231ps_fma(ZEXT1632(auVar179),local_680,auVar72);
          auVar115 = vsubps_avx(ZEXT1632(auVar197),ZEXT1632(auVar110));
          auVar126 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar159));
          auVar73._4_4_ = auVar115._4_4_ * auVar159._4_4_;
          auVar73._0_4_ = auVar115._0_4_ * auVar159._0_4_;
          auVar73._8_4_ = auVar115._8_4_ * auVar159._8_4_;
          auVar73._12_4_ = auVar115._12_4_ * auVar159._12_4_;
          auVar73._16_4_ = auVar115._16_4_ * 0.0;
          auVar73._20_4_ = auVar115._20_4_ * 0.0;
          auVar73._24_4_ = auVar115._24_4_ * 0.0;
          auVar73._28_4_ = 0;
          auVar179 = vfmsub231ps_fma(auVar73,ZEXT1632(auVar110),auVar126);
          auVar74._4_4_ = auVar231._4_4_ * auVar126._4_4_;
          auVar74._0_4_ = auVar231._0_4_ * auVar126._0_4_;
          auVar74._8_4_ = auVar231._8_4_ * auVar126._8_4_;
          auVar74._12_4_ = auVar231._12_4_ * auVar126._12_4_;
          auVar74._16_4_ = auVar126._16_4_ * 0.0;
          auVar74._20_4_ = auVar126._20_4_ * 0.0;
          auVar74._24_4_ = auVar126._24_4_ * 0.0;
          auVar74._28_4_ = auVar126._28_4_;
          auVar209 = ZEXT1632(auVar231);
          auVar126 = vsubps_avx(ZEXT1632(auVar10),auVar209);
          auVar123 = ZEXT1632(auVar159);
          auVar178 = vfmsub231ps_fma(auVar74,auVar123,auVar126);
          auVar75._4_4_ = auVar110._4_4_ * auVar126._4_4_;
          auVar75._0_4_ = auVar110._0_4_ * auVar126._0_4_;
          auVar75._8_4_ = auVar110._8_4_ * auVar126._8_4_;
          auVar75._12_4_ = auVar110._12_4_ * auVar126._12_4_;
          auVar75._16_4_ = auVar126._16_4_ * 0.0;
          auVar75._20_4_ = auVar126._20_4_ * 0.0;
          auVar75._24_4_ = auVar126._24_4_ * 0.0;
          auVar75._28_4_ = auVar126._28_4_;
          auVar231 = vfmsub231ps_fma(auVar75,auVar209,auVar115);
          auVar178 = vfmadd231ps_fma(ZEXT1632(auVar231),ZEXT832(0) << 0x20,ZEXT1632(auVar178));
          auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),ZEXT832(0) << 0x20,ZEXT1632(auVar179));
          auVar234 = vcmpps_avx(ZEXT1632(auVar178),ZEXT832(0) << 0x20,2);
          auVar115 = vblendvps_avx(ZEXT1632(auVar111),ZEXT1632(auVar6),auVar234);
          auVar126 = vblendvps_avx(ZEXT1632(auVar136),ZEXT1632(auVar8),auVar234);
          auVar120 = vblendvps_avx(ZEXT1632(auVar174),ZEXT1632(auVar9),auVar234);
          auVar145 = vblendvps_avx(auVar209,ZEXT1632(auVar10),auVar234);
          auVar124 = vblendvps_avx(ZEXT1632(auVar110),ZEXT1632(auVar197),auVar234);
          auVar18 = vblendvps_avx(auVar123,ZEXT1632(auVar5),auVar234);
          auVar209 = vblendvps_avx(ZEXT1632(auVar10),auVar209,auVar234);
          auVar112 = vblendvps_avx(ZEXT1632(auVar197),ZEXT1632(auVar110),auVar234);
          auVar178 = vpackssdw_avx(local_4e0._0_16_,local_4e0._16_16_);
          auVar123 = vblendvps_avx(ZEXT1632(auVar5),auVar123,auVar234);
          auVar209 = vsubps_avx(auVar209,auVar115);
          auVar112 = vsubps_avx(auVar112,auVar126);
          auVar123 = vsubps_avx(auVar123,auVar120);
          auVar225 = ZEXT3264(auVar123);
          auVar22 = vsubps_avx(auVar115,auVar145);
          auVar140 = vsubps_avx(auVar126,auVar124);
          auVar168 = vsubps_avx(auVar120,auVar18);
          auVar194._0_4_ = auVar123._0_4_ * auVar115._0_4_;
          auVar194._4_4_ = auVar123._4_4_ * auVar115._4_4_;
          auVar194._8_4_ = auVar123._8_4_ * auVar115._8_4_;
          auVar194._12_4_ = auVar123._12_4_ * auVar115._12_4_;
          auVar194._16_4_ = auVar123._16_4_ * auVar115._16_4_;
          auVar194._20_4_ = auVar123._20_4_ * auVar115._20_4_;
          auVar194._24_4_ = auVar123._24_4_ * auVar115._24_4_;
          auVar194._28_4_ = 0;
          auVar179 = vfmsub231ps_fma(auVar194,auVar120,auVar209);
          auVar149._0_4_ = auVar209._0_4_ * auVar126._0_4_;
          auVar149._4_4_ = auVar209._4_4_ * auVar126._4_4_;
          auVar149._8_4_ = auVar209._8_4_ * auVar126._8_4_;
          auVar149._12_4_ = auVar209._12_4_ * auVar126._12_4_;
          auVar149._16_4_ = auVar209._16_4_ * auVar126._16_4_;
          auVar149._20_4_ = auVar209._20_4_ * auVar126._20_4_;
          auVar149._24_4_ = auVar209._24_4_ * auVar126._24_4_;
          auVar149._28_4_ = 0;
          auVar5 = vfmsub231ps_fma(auVar149,auVar115,auVar112);
          auVar179 = vfmadd231ps_fma(ZEXT1632(auVar5),ZEXT832(0) << 0x20,ZEXT1632(auVar179));
          auVar195._0_4_ = auVar112._0_4_ * auVar120._0_4_;
          auVar195._4_4_ = auVar112._4_4_ * auVar120._4_4_;
          auVar195._8_4_ = auVar112._8_4_ * auVar120._8_4_;
          auVar195._12_4_ = auVar112._12_4_ * auVar120._12_4_;
          auVar195._16_4_ = auVar112._16_4_ * auVar120._16_4_;
          auVar195._20_4_ = auVar112._20_4_ * auVar120._20_4_;
          auVar195._24_4_ = auVar112._24_4_ * auVar120._24_4_;
          auVar195._28_4_ = 0;
          auVar5 = vfmsub231ps_fma(auVar195,auVar126,auVar123);
          auVar5 = vfmadd231ps_fma(ZEXT1632(auVar179),ZEXT832(0) << 0x20,ZEXT1632(auVar5));
          auVar196._0_4_ = auVar168._0_4_ * auVar145._0_4_;
          auVar196._4_4_ = auVar168._4_4_ * auVar145._4_4_;
          auVar196._8_4_ = auVar168._8_4_ * auVar145._8_4_;
          auVar196._12_4_ = auVar168._12_4_ * auVar145._12_4_;
          auVar196._16_4_ = auVar168._16_4_ * auVar145._16_4_;
          auVar196._20_4_ = auVar168._20_4_ * auVar145._20_4_;
          auVar196._24_4_ = auVar168._24_4_ * auVar145._24_4_;
          auVar196._28_4_ = 0;
          auVar179 = vfmsub231ps_fma(auVar196,auVar22,auVar18);
          auVar76._4_4_ = auVar140._4_4_ * auVar18._4_4_;
          auVar76._0_4_ = auVar140._0_4_ * auVar18._0_4_;
          auVar76._8_4_ = auVar140._8_4_ * auVar18._8_4_;
          auVar76._12_4_ = auVar140._12_4_ * auVar18._12_4_;
          auVar76._16_4_ = auVar140._16_4_ * auVar18._16_4_;
          auVar76._20_4_ = auVar140._20_4_ * auVar18._20_4_;
          auVar76._24_4_ = auVar140._24_4_ * auVar18._24_4_;
          auVar76._28_4_ = auVar18._28_4_;
          auVar6 = vfmsub231ps_fma(auVar76,auVar124,auVar168);
          auVar77._4_4_ = auVar22._4_4_ * auVar124._4_4_;
          auVar77._0_4_ = auVar22._0_4_ * auVar124._0_4_;
          auVar77._8_4_ = auVar22._8_4_ * auVar124._8_4_;
          auVar77._12_4_ = auVar22._12_4_ * auVar124._12_4_;
          auVar77._16_4_ = auVar22._16_4_ * auVar124._16_4_;
          auVar77._20_4_ = auVar22._20_4_ * auVar124._20_4_;
          auVar77._24_4_ = auVar22._24_4_ * auVar124._24_4_;
          auVar77._28_4_ = auVar124._28_4_;
          auVar8 = vfmsub231ps_fma(auVar77,auVar140,auVar145);
          auVar124 = ZEXT832(0) << 0x20;
          auVar179 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar124,ZEXT1632(auVar179));
          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar124,ZEXT1632(auVar6));
          auVar145 = vmaxps_avx(ZEXT1632(auVar5),ZEXT1632(auVar6));
          auVar145 = vcmpps_avx(auVar145,auVar124,2);
          auVar179 = vpackssdw_avx(auVar145._0_16_,auVar145._16_16_);
          auVar178 = vpand_avx(auVar179,auVar178);
          auVar145 = vpmovsxwd_avx2(auVar178);
          if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar145 >> 0x7f,0) == '\0') &&
                (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar145 >> 0xbf,0) == '\0') &&
              (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar145[0x1f]) {
            auVar182._8_8_ = uStack_578;
            auVar182._0_8_ = local_580;
            auVar182._16_8_ = uStack_570;
            auVar182._24_8_ = uStack_568;
          }
          else {
            auVar78._4_4_ = auVar112._4_4_ * auVar168._4_4_;
            auVar78._0_4_ = auVar112._0_4_ * auVar168._0_4_;
            auVar78._8_4_ = auVar112._8_4_ * auVar168._8_4_;
            auVar78._12_4_ = auVar112._12_4_ * auVar168._12_4_;
            auVar78._16_4_ = auVar112._16_4_ * auVar168._16_4_;
            auVar78._20_4_ = auVar112._20_4_ * auVar168._20_4_;
            auVar78._24_4_ = auVar112._24_4_ * auVar168._24_4_;
            auVar78._28_4_ = auVar145._28_4_;
            auVar10 = vfmsub231ps_fma(auVar78,auVar140,auVar123);
            auVar203._0_4_ = auVar123._0_4_ * auVar22._0_4_;
            auVar203._4_4_ = auVar123._4_4_ * auVar22._4_4_;
            auVar203._8_4_ = auVar123._8_4_ * auVar22._8_4_;
            auVar203._12_4_ = auVar123._12_4_ * auVar22._12_4_;
            auVar203._16_4_ = auVar123._16_4_ * auVar22._16_4_;
            auVar203._20_4_ = auVar123._20_4_ * auVar22._20_4_;
            auVar203._24_4_ = auVar123._24_4_ * auVar22._24_4_;
            auVar203._28_4_ = 0;
            auVar9 = vfmsub231ps_fma(auVar203,auVar209,auVar168);
            auVar79._4_4_ = auVar209._4_4_ * auVar140._4_4_;
            auVar79._0_4_ = auVar209._0_4_ * auVar140._0_4_;
            auVar79._8_4_ = auVar209._8_4_ * auVar140._8_4_;
            auVar79._12_4_ = auVar209._12_4_ * auVar140._12_4_;
            auVar79._16_4_ = auVar209._16_4_ * auVar140._16_4_;
            auVar79._20_4_ = auVar209._20_4_ * auVar140._20_4_;
            auVar79._24_4_ = auVar209._24_4_ * auVar140._24_4_;
            auVar79._28_4_ = auVar140._28_4_;
            auVar197 = vfmsub231ps_fma(auVar79,auVar22,auVar112);
            auVar179 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar9),ZEXT1632(auVar197));
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar179),ZEXT1632(auVar10),_DAT_01f7b000);
            auVar145 = vrcpps_avx(ZEXT1632(auVar8));
            auVar224._8_4_ = 0x3f800000;
            auVar224._0_8_ = 0x3f8000003f800000;
            auVar224._12_4_ = 0x3f800000;
            auVar224._16_4_ = 0x3f800000;
            auVar224._20_4_ = 0x3f800000;
            auVar224._24_4_ = 0x3f800000;
            auVar224._28_4_ = 0x3f800000;
            auVar225 = ZEXT3264(auVar224);
            auVar179 = vfnmadd213ps_fma(auVar145,ZEXT1632(auVar8),auVar224);
            auVar179 = vfmadd132ps_fma(ZEXT1632(auVar179),auVar145,auVar145);
            auVar80._4_4_ = auVar197._4_4_ * auVar120._4_4_;
            auVar80._0_4_ = auVar197._0_4_ * auVar120._0_4_;
            auVar80._8_4_ = auVar197._8_4_ * auVar120._8_4_;
            auVar80._12_4_ = auVar197._12_4_ * auVar120._12_4_;
            auVar80._16_4_ = auVar120._16_4_ * 0.0;
            auVar80._20_4_ = auVar120._20_4_ * 0.0;
            auVar80._24_4_ = auVar120._24_4_ * 0.0;
            auVar80._28_4_ = auVar120._28_4_;
            auVar9 = vfmadd231ps_fma(auVar80,auVar126,ZEXT1632(auVar9));
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar10),auVar115);
            fVar157 = auVar179._0_4_;
            fVar156 = auVar179._4_4_;
            fVar129 = auVar179._8_4_;
            fVar130 = auVar179._12_4_;
            auVar145 = ZEXT1632(CONCAT412(fVar130 * auVar9._12_4_,
                                          CONCAT48(fVar129 * auVar9._8_4_,
                                                   CONCAT44(fVar156 * auVar9._4_4_,
                                                            fVar157 * auVar9._0_4_))));
            uVar107 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar181._4_4_ = uVar107;
            auVar181._0_4_ = uVar107;
            auVar181._8_4_ = uVar107;
            auVar181._12_4_ = uVar107;
            auVar181._16_4_ = uVar107;
            auVar181._20_4_ = uVar107;
            auVar181._24_4_ = uVar107;
            auVar181._28_4_ = uVar107;
            auVar95._4_4_ = uStack_11c;
            auVar95._0_4_ = local_120;
            auVar95._8_4_ = uStack_118;
            auVar95._12_4_ = uStack_114;
            auVar95._16_4_ = uStack_110;
            auVar95._20_4_ = uStack_10c;
            auVar95._24_4_ = uStack_108;
            auVar95._28_4_ = uStack_104;
            auVar115 = vcmpps_avx(auVar95,auVar145,2);
            auVar120 = vcmpps_avx(auVar145,auVar181,2);
            auVar115 = vandps_avx(auVar120,auVar115);
            auVar179 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
            auVar178 = vpand_avx(auVar178,auVar179);
            auVar115 = vpmovsxwd_avx2(auVar178);
            if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar115 >> 0x7f,0) == '\0') &&
                  (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar115 >> 0xbf,0) == '\0') &&
                (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar115[0x1f]) {
              auVar182._8_8_ = uStack_578;
              auVar182._0_8_ = local_580;
              auVar182._16_8_ = uStack_570;
              auVar182._24_8_ = uStack_568;
            }
            else {
              auVar115 = vcmpps_avx(ZEXT1632(auVar8),ZEXT832(0) << 0x20,4);
              auVar179 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
              auVar178 = vpand_avx(auVar178,auVar179);
              auVar115 = vpmovsxwd_avx2(auVar178);
              auVar182._8_8_ = uStack_578;
              auVar182._0_8_ = local_580;
              auVar182._16_8_ = uStack_570;
              auVar182._24_8_ = uStack_568;
              if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar115 >> 0x7f,0) != '\0') ||
                    (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar115 >> 0xbf,0) != '\0') ||
                  (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar115[0x1f] < '\0') {
                auVar81._28_4_ = auVar126._28_4_;
                auVar81._0_28_ =
                     ZEXT1628(CONCAT412(fVar130 * auVar5._12_4_,
                                        CONCAT48(fVar129 * auVar5._8_4_,
                                                 CONCAT44(fVar156 * auVar5._4_4_,
                                                          fVar157 * auVar5._0_4_))));
                auVar82._28_4_ = SUB84(uStack_568,4);
                auVar82._0_28_ =
                     ZEXT1628(CONCAT412(fVar130 * auVar6._12_4_,
                                        CONCAT48(fVar129 * auVar6._8_4_,
                                                 CONCAT44(fVar156 * auVar6._4_4_,
                                                          fVar157 * auVar6._0_4_))));
                auVar210._8_4_ = 0x3f800000;
                auVar210._0_8_ = 0x3f8000003f800000;
                auVar210._12_4_ = 0x3f800000;
                auVar210._16_4_ = 0x3f800000;
                auVar210._20_4_ = 0x3f800000;
                auVar210._24_4_ = 0x3f800000;
                auVar210._28_4_ = 0x3f800000;
                auVar126 = vsubps_avx(auVar210,auVar81);
                local_700 = vblendvps_avx(auVar126,auVar81,auVar234);
                auVar126 = vsubps_avx(auVar210,auVar82);
                local_3e0 = vblendvps_avx(auVar126,auVar82,auVar234);
                local_3c0 = auVar145;
                auVar182 = auVar115;
              }
            }
          }
          auVar235 = ZEXT3264(local_740);
          auVar128 = ZEXT3264(auVar113);
          auVar215 = ZEXT3264(local_6c0);
          local_7e0._0_4_ = iVar105;
          if ((((((((auVar182 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar182 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar182 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar182 >> 0x7f,0) != '\0') ||
                (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar182 >> 0xbf,0) != '\0') ||
              (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar182[0x1f] < '\0') {
            auVar115 = vsubps_avx(local_680,auVar113);
            auVar178 = vfmadd213ps_fma(auVar115,local_700,auVar113);
            fVar157 = *(float *)((long)local_710->ray_space + k * 4 + -0x10);
            auVar83._4_4_ = (auVar178._4_4_ + auVar178._4_4_) * fVar157;
            auVar83._0_4_ = (auVar178._0_4_ + auVar178._0_4_) * fVar157;
            auVar83._8_4_ = (auVar178._8_4_ + auVar178._8_4_) * fVar157;
            auVar83._12_4_ = (auVar178._12_4_ + auVar178._12_4_) * fVar157;
            auVar83._16_4_ = fVar157 * 0.0;
            auVar83._20_4_ = fVar157 * 0.0;
            auVar83._24_4_ = fVar157 * 0.0;
            auVar83._28_4_ = fVar157;
            auVar115 = vcmpps_avx(local_3c0,auVar83,6);
            auVar128 = ZEXT3264(auVar115);
            auVar126 = auVar182 & auVar115;
            if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar126 >> 0x7f,0) != '\0') ||
                  (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar126 >> 0xbf,0) != '\0') ||
                (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar126[0x1f] < '\0') {
              auVar150._8_4_ = 0xbf800000;
              auVar150._0_8_ = 0xbf800000bf800000;
              auVar150._12_4_ = 0xbf800000;
              auVar150._16_4_ = 0xbf800000;
              auVar150._20_4_ = 0xbf800000;
              auVar150._24_4_ = 0xbf800000;
              auVar150._28_4_ = 0xbf800000;
              auVar172._8_4_ = 0x40000000;
              auVar172._0_8_ = 0x4000000040000000;
              auVar172._12_4_ = 0x40000000;
              auVar172._16_4_ = 0x40000000;
              auVar172._20_4_ = 0x40000000;
              auVar172._24_4_ = 0x40000000;
              auVar172._28_4_ = 0x40000000;
              auVar178 = vfmadd213ps_fma(local_3e0,auVar172,auVar150);
              local_2c0 = local_700;
              local_3e0 = ZEXT1632(auVar178);
              auVar126 = local_3e0;
              local_2a0 = ZEXT1632(auVar178);
              local_280 = local_3c0;
              local_25c = iVar105;
              local_250 = local_810;
              uStack_248 = uStack_808;
              local_240 = local_830;
              uStack_238 = uStack_828;
              local_230 = local_7c0._0_8_;
              uStack_228 = local_7c0._8_8_;
              local_220 = local_820;
              uStack_218 = uStack_818;
              pGVar14 = (context->scene->geometries).items[local_7e8].ptr;
              auVar154 = ZEXT3264(local_700);
              auVar173 = ZEXT3264(CONCAT428(fStack_624,
                                            CONCAT424(fStack_628,
                                                      CONCAT420(fStack_62c,
                                                                CONCAT416(fStack_630,
                                                                          CONCAT412(fStack_634,
                                                                                    CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
              if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_01435459;
              local_5c0 = vandps_avx(auVar115,auVar182);
              fVar157 = (float)local_260;
              local_1e0[0] = (fVar157 + local_700._0_4_ + 0.0) * local_140;
              local_1e0[1] = (fVar157 + local_700._4_4_ + 1.0) * fStack_13c;
              local_1e0[2] = (fVar157 + local_700._8_4_ + 2.0) * fStack_138;
              local_1e0[3] = (fVar157 + local_700._12_4_ + 3.0) * fStack_134;
              fStack_1d0 = (fVar157 + local_700._16_4_ + 4.0) * fStack_130;
              fStack_1cc = (fVar157 + local_700._20_4_ + 5.0) * fStack_12c;
              fStack_1c8 = (fVar157 + local_700._24_4_ + 6.0) * fStack_128;
              fStack_1c4 = fVar157 + local_700._28_4_ + 7.0;
              local_3e0._0_8_ = auVar178._0_8_;
              local_3e0._8_8_ = auVar178._8_8_;
              local_1c0 = local_3e0._0_8_;
              uStack_1b8 = local_3e0._8_8_;
              uStack_1b0 = 0;
              uStack_1a8 = 0;
              local_1a0 = local_3c0;
              auVar151._8_4_ = 0x7f800000;
              auVar151._0_8_ = 0x7f8000007f800000;
              auVar151._12_4_ = 0x7f800000;
              auVar151._16_4_ = 0x7f800000;
              auVar151._20_4_ = 0x7f800000;
              auVar151._24_4_ = 0x7f800000;
              auVar151._28_4_ = 0x7f800000;
              auVar115 = vblendvps_avx(auVar151,local_3c0,local_5c0);
              auVar120 = vshufps_avx(auVar115,auVar115,0xb1);
              auVar120 = vminps_avx(auVar115,auVar120);
              auVar145 = vshufpd_avx(auVar120,auVar120,5);
              auVar120 = vminps_avx(auVar120,auVar145);
              auVar145 = vpermpd_avx2(auVar120,0x4e);
              auVar120 = vminps_avx(auVar120,auVar145);
              auVar120 = vcmpps_avx(auVar115,auVar120,0);
              auVar145 = local_5c0 & auVar120;
              auVar115 = local_5c0;
              if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar145 >> 0x7f,0) != '\0') ||
                    (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar145 >> 0xbf,0) != '\0') ||
                  (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar145[0x1f] < '\0') {
                auVar115 = vandps_avx(auVar120,local_5c0);
              }
              uVar99 = vmovmskps_avx(auVar115);
              uVar102 = 0;
              for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x80000000) {
                uVar102 = uVar102 + 1;
              }
              uVar101 = (ulong)uVar102;
              local_3e0 = auVar126;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar157 = local_1e0[uVar101];
                auVar128 = ZEXT464((uint)fVar157);
                uVar107 = *(undefined4 *)((long)&local_1c0 + uVar101 * 4);
                fVar129 = 1.0 - fVar157;
                fVar156 = fVar129 * fVar129 * -3.0;
                auVar180 = vfmadd231ss_fma(ZEXT416((uint)(fVar129 * fVar129)),
                                           ZEXT416((uint)(fVar157 * fVar129)),ZEXT416(0xc0000000));
                auVar178 = vfmsub132ss_fma(ZEXT416((uint)(fVar157 * fVar129)),
                                           ZEXT416((uint)(fVar157 * fVar157)),ZEXT416(0x40000000));
                fVar129 = auVar180._0_4_ * 3.0;
                fVar130 = auVar178._0_4_ * 3.0;
                fVar131 = fVar157 * fVar157 * 3.0;
                auVar191._0_4_ = fVar131 * fVar21;
                auVar191._4_4_ = fVar131 * fVar206;
                auVar191._8_4_ = fVar131 * fVar19;
                auVar191._12_4_ = fVar131 * fVar20;
                auVar162._4_4_ = fVar130;
                auVar162._0_4_ = fVar130;
                auVar162._8_4_ = fVar130;
                auVar162._12_4_ = fVar130;
                auVar180 = vfmadd132ps_fma(auVar162,auVar191,local_7c0);
                auVar177._4_4_ = fVar129;
                auVar177._0_4_ = fVar129;
                auVar177._8_4_ = fVar129;
                auVar177._12_4_ = fVar129;
                auVar180 = vfmadd132ps_fma(auVar177,auVar180,auVar158);
                auVar163._4_4_ = fVar156;
                auVar163._0_4_ = fVar156;
                auVar163._8_4_ = fVar156;
                auVar163._12_4_ = fVar156;
                auVar180 = vfmadd132ps_fma(auVar163,auVar180,auVar7);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a0 + uVar101 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar180._0_4_;
                uVar13 = vextractps_avx(auVar180,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar13;
                uVar13 = vextractps_avx(auVar180,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar13;
                *(float *)(ray + k * 4 + 0xf0) = fVar157;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar107;
                *(int *)(ray + k * 4 + 0x110) = (int)local_708;
                *(int *)(ray + k * 4 + 0x120) = (int)local_7e8;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_7e0 = ZEXT1632(CONCAT124(auVar180._4_12_,iVar105));
                auVar180 = *local_718;
                local_8c0 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
                _local_360 = auVar139;
                while( true ) {
                  auVar115 = local_8c0;
                  local_440 = local_1e0[uVar101];
                  local_430 = *(undefined4 *)((long)&local_1c0 + uVar101 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a0 + uVar101 * 4);
                  fVar129 = 1.0 - local_440;
                  auVar179 = vfmadd231ss_fma(ZEXT416((uint)(fVar129 * fVar129)),
                                             ZEXT416((uint)(local_440 * fVar129)),
                                             ZEXT416(0xc0000000));
                  auVar178 = vfmsub132ss_fma(ZEXT416((uint)(local_440 * fVar129)),
                                             ZEXT416((uint)(local_440 * local_440)),
                                             ZEXT416(0x40000000));
                  fVar157 = auVar178._0_4_ * 3.0;
                  fVar156 = local_440 * local_440 * 3.0;
                  auVar192._0_4_ = fVar156 * fVar21;
                  auVar192._4_4_ = fVar156 * fVar206;
                  auVar192._8_4_ = fVar156 * fVar19;
                  auVar192._12_4_ = fVar156 * fVar20;
                  auVar164._4_4_ = fVar157;
                  auVar164._0_4_ = fVar157;
                  auVar164._8_4_ = fVar157;
                  auVar164._12_4_ = fVar157;
                  auVar178 = vfmadd132ps_fma(auVar164,auVar192,local_7c0);
                  fVar157 = auVar179._0_4_ * 3.0;
                  auVar184._4_4_ = fVar157;
                  auVar184._0_4_ = fVar157;
                  auVar184._8_4_ = fVar157;
                  auVar184._12_4_ = fVar157;
                  auVar178 = vfmadd132ps_fma(auVar184,auVar178,auVar158);
                  fVar157 = fVar129 * fVar129 * -3.0;
                  local_7b0.context = context->user;
                  auVar165._4_4_ = fVar157;
                  auVar165._0_4_ = fVar157;
                  auVar165._8_4_ = fVar157;
                  auVar165._12_4_ = fVar157;
                  auVar179 = vfmadd132ps_fma(auVar165,auVar178,auVar7);
                  local_470 = auVar179._0_4_;
                  uStack_46c = local_470;
                  uStack_468 = local_470;
                  uStack_464 = local_470;
                  auVar178 = vshufps_avx(auVar179,auVar179,0x55);
                  local_460 = auVar178;
                  local_450 = vshufps_avx(auVar179,auVar179,0xaa);
                  fStack_43c = local_440;
                  fStack_438 = local_440;
                  fStack_434 = local_440;
                  uStack_42c = local_430;
                  uStack_428 = local_430;
                  uStack_424 = local_430;
                  local_420 = local_690._0_8_;
                  uStack_418 = local_690._8_8_;
                  local_410._4_4_ = uStack_2cc;
                  local_410._0_4_ = local_2d0;
                  local_410._8_4_ = uStack_2c8;
                  local_410._12_4_ = uStack_2c4;
                  vpcmpeqd_avx2(ZEXT1632(local_410),ZEXT1632(local_410));
                  uStack_3fc = (local_7b0.context)->instID[0];
                  local_400 = uStack_3fc;
                  uStack_3f8 = uStack_3fc;
                  uStack_3f4 = uStack_3fc;
                  uStack_3f0 = (local_7b0.context)->instPrimID[0];
                  uStack_3ec = uStack_3f0;
                  uStack_3e8 = uStack_3f0;
                  uStack_3e4 = uStack_3f0;
                  local_7b0.valid = (int *)local_800;
                  local_7b0.geometryUserPtr = pGVar14->userPtr;
                  local_7b0.hit = (RTCHitN *)&local_470;
                  local_7b0.N = 4;
                  local_800 = auVar180;
                  local_7b0.ray = (RTCRayN *)ray;
                  if (pGVar14->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar225 = ZEXT1664(auVar225._0_16_);
                    (*pGVar14->intersectionFilterN)(&local_7b0);
                  }
                  if (local_800 == (undefined1  [16])0x0) {
                    auVar178 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar179 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
                    auVar178 = auVar178 ^ auVar179;
                  }
                  else {
                    p_Var17 = context->args->filter;
                    auVar179 = vpcmpeqd_avx(auVar178,auVar178);
                    if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar225 = ZEXT1664(auVar225._0_16_);
                      (*p_Var17)(&local_7b0);
                      auVar179 = vpcmpeqd_avx(auVar179,auVar179);
                    }
                    auVar5 = vpcmpeqd_avx(local_800,_DAT_01f45a50);
                    auVar178 = auVar5 ^ auVar179;
                    if (local_800 != (undefined1  [16])0x0) {
                      auVar5 = auVar5 ^ auVar179;
                      auVar179 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])local_7b0.hit);
                      *(undefined1 (*) [16])(local_7b0.ray + 0xc0) = auVar179;
                      auVar179 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])(local_7b0.hit + 0x10))
                      ;
                      *(undefined1 (*) [16])(local_7b0.ray + 0xd0) = auVar179;
                      auVar179 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])(local_7b0.hit + 0x20))
                      ;
                      *(undefined1 (*) [16])(local_7b0.ray + 0xe0) = auVar179;
                      auVar179 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])(local_7b0.hit + 0x30))
                      ;
                      *(undefined1 (*) [16])(local_7b0.ray + 0xf0) = auVar179;
                      auVar179 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])(local_7b0.hit + 0x40))
                      ;
                      *(undefined1 (*) [16])(local_7b0.ray + 0x100) = auVar179;
                      auVar179 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])(local_7b0.hit + 0x50))
                      ;
                      *(undefined1 (*) [16])(local_7b0.ray + 0x110) = auVar179;
                      auVar179 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])(local_7b0.hit + 0x60))
                      ;
                      *(undefined1 (*) [16])(local_7b0.ray + 0x120) = auVar179;
                      auVar179 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])(local_7b0.hit + 0x70))
                      ;
                      *(undefined1 (*) [16])(local_7b0.ray + 0x130) = auVar179;
                      auVar179 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])(local_7b0.hit + 0x80))
                      ;
                      *(undefined1 (*) [16])(local_7b0.ray + 0x140) = auVar179;
                    }
                  }
                  auVar126 = local_3c0;
                  auVar137._8_8_ = 0x100000001;
                  auVar137._0_8_ = 0x100000001;
                  if ((auVar137 & auVar178) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_8c0._0_4_;
                  }
                  else {
                    local_8c0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_8c0._4_4_ = 0;
                    local_8c0._8_4_ = 0;
                    local_8c0._12_4_ = 0;
                  }
                  *(undefined4 *)(local_5c0 + uVar101 * 4) = 0;
                  local_8c0._16_16_ = auVar115._16_16_;
                  auVar125._4_4_ = local_8c0._0_4_;
                  auVar125._0_4_ = local_8c0._0_4_;
                  auVar125._8_4_ = local_8c0._0_4_;
                  auVar125._12_4_ = local_8c0._0_4_;
                  auVar125._16_4_ = local_8c0._0_4_;
                  auVar125._20_4_ = local_8c0._0_4_;
                  auVar125._24_4_ = local_8c0._0_4_;
                  auVar125._28_4_ = local_8c0._0_4_;
                  auVar120 = vcmpps_avx(auVar126,auVar125,2);
                  auVar115 = vandps_avx(auVar120,local_5c0);
                  auVar128 = ZEXT3264(auVar115);
                  local_5c0 = local_5c0 & auVar120;
                  if ((((((((local_5c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_5c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_5c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_5c0 >> 0x7f,0) == '\0') &&
                        (local_5c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_5c0 >> 0xbf,0) == '\0') &&
                      (local_5c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_5c0[0x1f]) break;
                  auVar152._8_4_ = 0x7f800000;
                  auVar152._0_8_ = 0x7f8000007f800000;
                  auVar152._12_4_ = 0x7f800000;
                  auVar152._16_4_ = 0x7f800000;
                  auVar152._20_4_ = 0x7f800000;
                  auVar152._24_4_ = 0x7f800000;
                  auVar152._28_4_ = 0x7f800000;
                  auVar126 = vblendvps_avx(auVar152,auVar126,auVar115);
                  auVar120 = vshufps_avx(auVar126,auVar126,0xb1);
                  auVar120 = vminps_avx(auVar126,auVar120);
                  auVar145 = vshufpd_avx(auVar120,auVar120,5);
                  auVar120 = vminps_avx(auVar120,auVar145);
                  auVar145 = vpermpd_avx2(auVar120,0x4e);
                  auVar120 = vminps_avx(auVar120,auVar145);
                  auVar120 = vcmpps_avx(auVar126,auVar120,0);
                  auVar145 = auVar115 & auVar120;
                  auVar126 = auVar115;
                  if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar145 >> 0x7f,0) != '\0') ||
                        (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar145 >> 0xbf,0) != '\0') ||
                      (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar145[0x1f] < '\0') {
                    auVar126 = vandps_avx(auVar120,auVar115);
                  }
                  uVar99 = vmovmskps_avx(auVar126);
                  uVar102 = 0;
                  for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x80000000) {
                    uVar102 = uVar102 + 1;
                  }
                  uVar101 = (ulong)uVar102;
                  local_5c0 = auVar115;
                }
                auVar235 = ZEXT3264(local_740);
                auVar215 = ZEXT3264(local_6c0);
              }
            }
          }
          auVar154 = ZEXT3264(local_700);
          auVar173 = ZEXT3264(CONCAT428(fStack_624,
                                        CONCAT424(fStack_628,
                                                  CONCAT420(fStack_62c,
                                                            CONCAT416(fStack_630,
                                                                      CONCAT412(fStack_634,
                                                                                CONCAT48(fStack_638,
                                                                                         CONCAT44(
                                                  fStack_63c,local_640))))))));
          iVar105 = local_7e0._0_4_;
        }
LAB_01435459:
        auVar183 = ZEXT3264(local_5e0);
      }
    }
    uVar107 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar121._4_4_ = uVar107;
    auVar121._0_4_ = uVar107;
    auVar121._8_4_ = uVar107;
    auVar121._12_4_ = uVar107;
    auVar121._16_4_ = uVar107;
    auVar121._20_4_ = uVar107;
    auVar121._24_4_ = uVar107;
    auVar121._28_4_ = uVar107;
    auVar115 = vcmpps_avx(local_80,auVar121,2);
    uVar102 = vmovmskps_avx(auVar115);
    uVar100 = (ulong)((uint)uVar100 & (uint)uVar100 + 0xff & uVar102);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }